

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx::CurveNiIntersectorK<4,4>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  Primitive PVar8;
  uint uVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  void *pvVar12;
  __int_type_conflict _Var13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  uint uVar57;
  long lVar58;
  ulong uVar59;
  byte bVar60;
  uint uVar61;
  uint uVar62;
  ulong uVar63;
  ulong uVar64;
  float fVar65;
  float fVar92;
  float fVar93;
  vint4 bi_2;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar94;
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar69 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar97 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 extraout_var [56];
  vint4 ai;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float t1;
  float fVar144;
  float fVar154;
  float fVar155;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar156;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  vint4 bi;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar174;
  float fVar190;
  float fVar191;
  vint4 ai_2;
  undefined1 auVar175 [16];
  float fVar192;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar193;
  float fVar207;
  float fVar208;
  undefined1 auVar194 [16];
  float fVar209;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  vfloat4 b0;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  vint4 ai_1;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  float fVar229;
  float fVar241;
  float fVar242;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar244;
  float fVar245;
  float fVar246;
  undefined1 auVar239 [32];
  float fVar243;
  undefined1 auVar240 [32];
  float fVar247;
  float fVar254;
  float fVar255;
  __m128 a;
  float fVar256;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [32];
  float fVar257;
  float fVar268;
  float fVar269;
  vfloat4 a0_1;
  float fVar270;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar266 [32];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar267 [64];
  float fVar271;
  float fVar276;
  float fVar277;
  undefined1 auVar272 [16];
  float fVar279;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar278;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 auVar275 [64];
  float fVar284;
  float fVar288;
  float fVar289;
  undefined1 auVar285 [16];
  float fVar290;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  float fVar291;
  float fVar292;
  float fVar298;
  float fVar299;
  float fVar300;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  float fVar304;
  vfloat4 a0;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  vfloat_impl<4> p01;
  vfloat_impl<4> p02;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_5c8 [8];
  float fStack_5c0;
  float fStack_5bc;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [16];
  undefined1 (*local_480) [16];
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  float fStack_460;
  RTCFilterFunctionNArguments local_458;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 auStack_3b8 [16];
  uint auStack_3a8 [4];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [16];
  undefined1 local_248 [32];
  undefined1 local_228 [32];
  float afStack_208 [8];
  RTCHitN local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  undefined1 local_158 [32];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar206 [32];
  undefined1 auVar297 [32];
  
  PVar8 = prim[1];
  uVar63 = (ulong)(byte)PVar8;
  auVar73 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar73 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar198 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar198 = vinsertps_avx(auVar198,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar174 = *(float *)(prim + uVar63 * 0x19 + 0x12);
  auVar73 = vsubps_avx(auVar73,*(undefined1 (*) [16])(prim + uVar63 * 0x19 + 6));
  auVar118._0_4_ = fVar174 * auVar73._0_4_;
  auVar118._4_4_ = fVar174 * auVar73._4_4_;
  auVar118._8_4_ = fVar174 * auVar73._8_4_;
  auVar118._12_4_ = fVar174 * auVar73._12_4_;
  auVar210._0_4_ = fVar174 * auVar198._0_4_;
  auVar210._4_4_ = fVar174 * auVar198._4_4_;
  auVar210._8_4_ = fVar174 * auVar198._8_4_;
  auVar210._12_4_ = fVar174 * auVar198._12_4_;
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 4 + 6)));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar198 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 5 + 6)));
  auVar198 = vcvtdq2ps_avx(auVar198);
  auVar141 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 6 + 6)));
  auVar141 = vcvtdq2ps_avx(auVar141);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0xb + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar260 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar260 = vcvtdq2ps_avx(auVar260);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar63 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  uVar64 = (ulong)(uint)((int)(uVar63 * 9) * 2);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 + uVar63 + 6)));
  auVar67 = vcvtdq2ps_avx(auVar67);
  uVar64 = (ulong)(uint)((int)(uVar63 * 5) << 2);
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 + 6)));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar127 = vshufps_avx(auVar210,auVar210,0);
  auVar100 = vshufps_avx(auVar210,auVar210,0x55);
  auVar119 = vshufps_avx(auVar210,auVar210,0xaa);
  fVar174 = auVar119._0_4_;
  fVar144 = auVar119._4_4_;
  fVar190 = auVar119._8_4_;
  fVar154 = auVar119._12_4_;
  fVar193 = auVar100._0_4_;
  fVar207 = auVar100._4_4_;
  fVar208 = auVar100._8_4_;
  fVar209 = auVar100._12_4_;
  fVar191 = auVar127._0_4_;
  fVar155 = auVar127._4_4_;
  fVar192 = auVar127._8_4_;
  fVar156 = auVar127._12_4_;
  auVar272._0_4_ = fVar191 * auVar73._0_4_ + fVar193 * auVar198._0_4_ + fVar174 * auVar141._0_4_;
  auVar272._4_4_ = fVar155 * auVar73._4_4_ + fVar207 * auVar198._4_4_ + fVar144 * auVar141._4_4_;
  auVar272._8_4_ = fVar192 * auVar73._8_4_ + fVar208 * auVar198._8_4_ + fVar190 * auVar141._8_4_;
  auVar272._12_4_ = fVar156 * auVar73._12_4_ + fVar209 * auVar198._12_4_ + fVar154 * auVar141._12_4_
  ;
  auVar285._0_4_ = fVar191 * auVar15._0_4_ + fVar193 * auVar260._0_4_ + auVar16._0_4_ * fVar174;
  auVar285._4_4_ = fVar155 * auVar15._4_4_ + fVar207 * auVar260._4_4_ + auVar16._4_4_ * fVar144;
  auVar285._8_4_ = fVar192 * auVar15._8_4_ + fVar208 * auVar260._8_4_ + auVar16._8_4_ * fVar190;
  auVar285._12_4_ = fVar156 * auVar15._12_4_ + fVar209 * auVar260._12_4_ + auVar16._12_4_ * fVar154;
  auVar211._0_4_ = fVar191 * auVar66._0_4_ + fVar193 * auVar67._0_4_ + auVar99._0_4_ * fVar174;
  auVar211._4_4_ = fVar155 * auVar66._4_4_ + fVar207 * auVar67._4_4_ + auVar99._4_4_ * fVar144;
  auVar211._8_4_ = fVar192 * auVar66._8_4_ + fVar208 * auVar67._8_4_ + auVar99._8_4_ * fVar190;
  auVar211._12_4_ = fVar156 * auVar66._12_4_ + fVar209 * auVar67._12_4_ + auVar99._12_4_ * fVar154;
  auVar127 = vshufps_avx(auVar118,auVar118,0);
  auVar100 = vshufps_avx(auVar118,auVar118,0x55);
  auVar119 = vshufps_avx(auVar118,auVar118,0xaa);
  fVar174 = auVar119._0_4_;
  fVar144 = auVar119._4_4_;
  fVar190 = auVar119._8_4_;
  fVar154 = auVar119._12_4_;
  fVar193 = auVar100._0_4_;
  fVar207 = auVar100._4_4_;
  fVar208 = auVar100._8_4_;
  fVar209 = auVar100._12_4_;
  fVar191 = auVar127._0_4_;
  fVar155 = auVar127._4_4_;
  fVar192 = auVar127._8_4_;
  fVar156 = auVar127._12_4_;
  auVar157._0_4_ = fVar191 * auVar73._0_4_ + fVar193 * auVar198._0_4_ + fVar174 * auVar141._0_4_;
  auVar157._4_4_ = fVar155 * auVar73._4_4_ + fVar207 * auVar198._4_4_ + fVar144 * auVar141._4_4_;
  auVar157._8_4_ = fVar192 * auVar73._8_4_ + fVar208 * auVar198._8_4_ + fVar190 * auVar141._8_4_;
  auVar157._12_4_ = fVar156 * auVar73._12_4_ + fVar209 * auVar198._12_4_ + fVar154 * auVar141._12_4_
  ;
  auVar100._0_4_ = fVar191 * auVar15._0_4_ + auVar16._0_4_ * fVar174 + fVar193 * auVar260._0_4_;
  auVar100._4_4_ = fVar155 * auVar15._4_4_ + auVar16._4_4_ * fVar144 + fVar207 * auVar260._4_4_;
  auVar100._8_4_ = fVar192 * auVar15._8_4_ + auVar16._8_4_ * fVar190 + fVar208 * auVar260._8_4_;
  auVar100._12_4_ = fVar156 * auVar15._12_4_ + auVar16._12_4_ * fVar154 + fVar209 * auVar260._12_4_;
  auVar127._0_4_ = fVar191 * auVar66._0_4_ + fVar193 * auVar67._0_4_ + auVar99._0_4_ * fVar174;
  auVar127._4_4_ = fVar155 * auVar66._4_4_ + fVar207 * auVar67._4_4_ + auVar99._4_4_ * fVar144;
  auVar127._8_4_ = fVar192 * auVar66._8_4_ + fVar208 * auVar67._8_4_ + auVar99._8_4_ * fVar190;
  auVar127._12_4_ = fVar156 * auVar66._12_4_ + fVar209 * auVar67._12_4_ + auVar99._12_4_ * fVar154;
  auVar194._8_4_ = 0x7fffffff;
  auVar194._0_8_ = 0x7fffffff7fffffff;
  auVar194._12_4_ = 0x7fffffff;
  auVar73 = vandps_avx(auVar272,auVar194);
  auVar145._8_4_ = 0x219392ef;
  auVar145._0_8_ = 0x219392ef219392ef;
  auVar145._12_4_ = 0x219392ef;
  auVar73 = vcmpps_avx(auVar73,auVar145,1);
  auVar198 = vblendvps_avx(auVar272,auVar145,auVar73);
  auVar73 = vandps_avx(auVar285,auVar194);
  auVar73 = vcmpps_avx(auVar73,auVar145,1);
  auVar141 = vblendvps_avx(auVar285,auVar145,auVar73);
  auVar73 = vandps_avx(auVar211,auVar194);
  auVar73 = vcmpps_avx(auVar73,auVar145,1);
  auVar73 = vblendvps_avx(auVar211,auVar145,auVar73);
  auVar15 = vrcpps_avx(auVar198);
  fVar193 = auVar15._0_4_;
  auVar119._0_4_ = fVar193 * auVar198._0_4_;
  fVar207 = auVar15._4_4_;
  auVar119._4_4_ = fVar207 * auVar198._4_4_;
  fVar208 = auVar15._8_4_;
  auVar119._8_4_ = fVar208 * auVar198._8_4_;
  fVar209 = auVar15._12_4_;
  auVar119._12_4_ = fVar209 * auVar198._12_4_;
  auVar212._8_4_ = 0x3f800000;
  auVar212._0_8_ = 0x3f8000003f800000;
  auVar212._12_4_ = 0x3f800000;
  auVar198 = vsubps_avx(auVar212,auVar119);
  fVar193 = fVar193 + fVar193 * auVar198._0_4_;
  fVar207 = fVar207 + fVar207 * auVar198._4_4_;
  fVar208 = fVar208 + fVar208 * auVar198._8_4_;
  fVar209 = fVar209 + fVar209 * auVar198._12_4_;
  auVar198 = vrcpps_avx(auVar141);
  fVar174 = auVar198._0_4_;
  auVar175._0_4_ = fVar174 * auVar141._0_4_;
  fVar190 = auVar198._4_4_;
  auVar175._4_4_ = fVar190 * auVar141._4_4_;
  fVar191 = auVar198._8_4_;
  auVar175._8_4_ = fVar191 * auVar141._8_4_;
  fVar192 = auVar198._12_4_;
  auVar175._12_4_ = fVar192 * auVar141._12_4_;
  auVar198 = vsubps_avx(auVar212,auVar175);
  fVar174 = fVar174 + fVar174 * auVar198._0_4_;
  fVar190 = fVar190 + fVar190 * auVar198._4_4_;
  fVar191 = fVar191 + fVar191 * auVar198._8_4_;
  fVar192 = fVar192 + fVar192 * auVar198._12_4_;
  auVar198 = vrcpps_avx(auVar73);
  fVar144 = auVar198._0_4_;
  auVar146._0_4_ = fVar144 * auVar73._0_4_;
  fVar154 = auVar198._4_4_;
  auVar146._4_4_ = fVar154 * auVar73._4_4_;
  fVar155 = auVar198._8_4_;
  auVar146._8_4_ = fVar155 * auVar73._8_4_;
  fVar156 = auVar198._12_4_;
  auVar146._12_4_ = fVar156 * auVar73._12_4_;
  auVar73 = vsubps_avx(auVar212,auVar146);
  fVar144 = fVar144 + fVar144 * auVar73._0_4_;
  fVar154 = fVar154 + fVar154 * auVar73._4_4_;
  fVar155 = fVar155 + fVar155 * auVar73._8_4_;
  fVar156 = fVar156 + fVar156 * auVar73._12_4_;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar63 * 7 + 6);
  auVar73 = vpmovsxwd_avx(auVar73);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar157);
  auVar120._0_4_ = fVar193 * auVar73._0_4_;
  auVar120._4_4_ = fVar207 * auVar73._4_4_;
  auVar120._8_4_ = fVar208 * auVar73._8_4_;
  auVar120._12_4_ = fVar209 * auVar73._12_4_;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = *(ulong *)(prim + uVar63 * 9 + 6);
  auVar73 = vpmovsxwd_avx(auVar198);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar157);
  auVar158._0_4_ = fVar193 * auVar73._0_4_;
  auVar158._4_4_ = fVar207 * auVar73._4_4_;
  auVar158._8_4_ = fVar208 * auVar73._8_4_;
  auVar158._12_4_ = fVar209 * auVar73._12_4_;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar198 = vpmovsxwd_avx(auVar141);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar63 * -2 + 6);
  auVar73 = vpmovsxwd_avx(auVar15);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar100);
  auVar222._0_4_ = auVar73._0_4_ * fVar174;
  auVar222._4_4_ = auVar73._4_4_ * fVar190;
  auVar222._8_4_ = auVar73._8_4_ * fVar191;
  auVar222._12_4_ = auVar73._12_4_ * fVar192;
  auVar73 = vcvtdq2ps_avx(auVar198);
  auVar73 = vsubps_avx(auVar73,auVar100);
  auVar99._0_4_ = fVar174 * auVar73._0_4_;
  auVar99._4_4_ = fVar190 * auVar73._4_4_;
  auVar99._8_4_ = fVar191 * auVar73._8_4_;
  auVar99._12_4_ = fVar192 * auVar73._12_4_;
  auVar260._8_8_ = 0;
  auVar260._0_8_ = *(ulong *)(prim + uVar64 + uVar63 + 6);
  auVar73 = vpmovsxwd_avx(auVar260);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar127);
  auVar176._0_4_ = auVar73._0_4_ * fVar144;
  auVar176._4_4_ = auVar73._4_4_ * fVar154;
  auVar176._8_4_ = auVar73._8_4_ * fVar155;
  auVar176._12_4_ = auVar73._12_4_ * fVar156;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar63 * 0x17 + 6);
  auVar73 = vpmovsxwd_avx(auVar16);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar127);
  auVar66._0_4_ = auVar73._0_4_ * fVar144;
  auVar66._4_4_ = auVar73._4_4_ * fVar154;
  auVar66._8_4_ = auVar73._8_4_ * fVar155;
  auVar66._12_4_ = auVar73._12_4_ * fVar156;
  auVar73 = vpminsd_avx(auVar120,auVar158);
  auVar198 = vpminsd_avx(auVar222,auVar99);
  auVar73 = vmaxps_avx(auVar73,auVar198);
  auVar198 = vpminsd_avx(auVar176,auVar66);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar230._4_4_ = uVar6;
  auVar230._0_4_ = uVar6;
  auVar230._8_4_ = uVar6;
  auVar230._12_4_ = uVar6;
  auVar198 = vmaxps_avx(auVar198,auVar230);
  auVar73 = vmaxps_avx(auVar73,auVar198);
  local_378._0_4_ = auVar73._0_4_ * 0.99999964;
  local_378._4_4_ = auVar73._4_4_ * 0.99999964;
  local_378._8_4_ = auVar73._8_4_ * 0.99999964;
  local_378._12_4_ = auVar73._12_4_ * 0.99999964;
  auVar73 = vpmaxsd_avx(auVar120,auVar158);
  auVar198 = vpmaxsd_avx(auVar222,auVar99);
  auVar73 = vminps_avx(auVar73,auVar198);
  auVar198 = vpmaxsd_avx(auVar176,auVar66);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar121._4_4_ = uVar6;
  auVar121._0_4_ = uVar6;
  auVar121._8_4_ = uVar6;
  auVar121._12_4_ = uVar6;
  auVar198 = vminps_avx(auVar198,auVar121);
  auVar73 = vminps_avx(auVar73,auVar198);
  auVar67._0_4_ = auVar73._0_4_ * 1.0000004;
  auVar67._4_4_ = auVar73._4_4_ * 1.0000004;
  auVar67._8_4_ = auVar73._8_4_ * 1.0000004;
  auVar67._12_4_ = auVar73._12_4_ * 1.0000004;
  auVar73 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar198 = vpcmpgtd_avx(auVar73,_DAT_01f7fcf0);
  auVar73 = vcmpps_avx(local_378,auVar67,2);
  auVar73 = vandps_avx(auVar73,auVar198);
  uVar57 = vmovmskps_avx(auVar73);
  if (uVar57 == 0) {
    return;
  }
  uVar57 = uVar57 & 0xff;
  auVar86._16_16_ = mm_lookupmask_ps._240_16_;
  auVar86._0_16_ = mm_lookupmask_ps._240_16_;
  local_158 = vblendps_avx(auVar86,ZEXT832(0) << 0x20,0x80);
  local_480 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  do {
    uVar64 = (ulong)uVar57;
    lVar58 = 0;
    if (uVar64 != 0) {
      for (; (uVar57 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
      }
    }
    uVar57 = *(uint *)(prim + 2);
    uVar9 = *(uint *)(prim + lVar58 * 4 + 6);
    pGVar10 = (context->scene->geometries).items[uVar57].ptr;
    uVar63 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                             pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * (ulong)uVar9);
    p_Var11 = pGVar10[1].intersectionFilterN;
    pvVar12 = pGVar10[2].userPtr;
    _Var13 = pGVar10[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    pfVar3 = (float *)(_Var13 + uVar63 * (long)pvVar12);
    fVar174 = *pfVar3;
    fVar144 = pfVar3[1];
    fVar190 = pfVar3[2];
    fVar154 = pfVar3[3];
    pfVar4 = (float *)(_Var13 + (uVar63 + 1) * (long)pvVar12);
    pfVar5 = (float *)(_Var13 + (uVar63 + 2) * (long)pvVar12);
    pfVar3 = (float *)(_Var13 + (long)pvVar12 * (uVar63 + 3));
    fVar191 = *pfVar3;
    fVar155 = pfVar3[1];
    fVar192 = pfVar3[2];
    fVar156 = pfVar3[3];
    uVar64 = uVar64 - 1 & uVar64;
    lVar58 = *(long *)&pGVar10[1].time_range.upper;
    pfVar3 = (float *)(lVar58 + (long)p_Var11 * uVar63);
    fVar193 = *pfVar3;
    fVar207 = pfVar3[1];
    fVar208 = pfVar3[2];
    fVar209 = pfVar3[3];
    pfVar3 = (float *)(lVar58 + (long)p_Var11 * (uVar63 + 1));
    pfVar1 = (float *)(lVar58 + (long)p_Var11 * (uVar63 + 2));
    lVar14 = 0;
    if (uVar64 != 0) {
      for (; (uVar64 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
      }
    }
    pfVar2 = (float *)(lVar58 + (long)p_Var11 * (uVar63 + 3));
    fVar65 = *pfVar2;
    fVar92 = pfVar2[1];
    fVar93 = pfVar2[2];
    fVar94 = pfVar2[3];
    if (((uVar64 != 0) && (uVar63 = uVar64 - 1 & uVar64, uVar63 != 0)) && (lVar58 = 0, uVar63 != 0))
    {
      for (; (uVar63 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
      }
    }
    auVar73 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                            0x1c);
    auVar141 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    fVar247 = *pfVar1 * 0.0;
    fVar254 = pfVar1[1] * 0.0;
    fVar255 = pfVar1[2] * 0.0;
    fVar256 = pfVar1[3] * 0.0;
    fVar257 = fVar247 + fVar65 * 0.0;
    fVar268 = fVar254 + fVar92 * 0.0;
    fVar269 = fVar255 + fVar93 * 0.0;
    fVar270 = fVar256 + fVar94 * 0.0;
    fVar271 = *pfVar3 * 0.0;
    fVar276 = pfVar3[1] * 0.0;
    fVar277 = pfVar3[2] * 0.0;
    fVar278 = pfVar3[3] * 0.0;
    local_5c8._0_4_ = fVar193 + fVar271 + fVar257;
    local_5c8._4_4_ = fVar207 + fVar276 + fVar268;
    fStack_5c0 = fVar208 + fVar277 + fVar269;
    fStack_5bc = fVar209 + fVar278 + fVar270;
    auVar122._0_4_ = fVar257 + *pfVar3 * 3.0;
    auVar122._4_4_ = fVar268 + pfVar3[1] * 3.0;
    auVar122._8_4_ = fVar269 + pfVar3[2] * 3.0;
    auVar122._12_4_ = fVar270 + pfVar3[3] * 3.0;
    auVar258._0_4_ = fVar193 * 3.0;
    auVar258._4_4_ = fVar207 * 3.0;
    auVar258._8_4_ = fVar208 * 3.0;
    auVar258._12_4_ = fVar209 * 3.0;
    auVar99 = vsubps_avx(auVar122,auVar258);
    fVar284 = *pfVar5 * 0.0;
    fVar288 = pfVar5[1] * 0.0;
    fVar289 = pfVar5[2] * 0.0;
    fVar290 = pfVar5[3] * 0.0;
    fVar257 = fVar284 + fVar191 * 0.0;
    fVar268 = fVar288 + fVar155 * 0.0;
    fVar269 = fVar289 + fVar192 * 0.0;
    fVar270 = fVar290 + fVar156 * 0.0;
    fVar292 = *pfVar4 * 0.0;
    fVar298 = pfVar4[1] * 0.0;
    fVar299 = pfVar4[2] * 0.0;
    fVar300 = pfVar4[3] * 0.0;
    auVar301._0_4_ = fVar292 + fVar257 + fVar174;
    auVar301._4_4_ = fVar298 + fVar268 + fVar144;
    auVar301._8_4_ = fVar299 + fVar269 + fVar190;
    auVar301._12_4_ = fVar300 + fVar270 + fVar154;
    auVar147._0_4_ = fVar257 + *pfVar4 * 3.0;
    auVar147._4_4_ = fVar268 + pfVar4[1] * 3.0;
    auVar147._8_4_ = fVar269 + pfVar4[2] * 3.0;
    auVar147._12_4_ = fVar270 + pfVar4[3] * 3.0;
    auVar259._0_4_ = fVar174 * 3.0;
    auVar259._4_4_ = fVar144 * 3.0;
    auVar259._8_4_ = fVar190 * 3.0;
    auVar259._12_4_ = fVar154 * 3.0;
    auVar260 = vsubps_avx(auVar147,auVar259);
    auVar223._0_4_ = fVar193 * 0.0;
    auVar223._4_4_ = fVar207 * 0.0;
    auVar223._8_4_ = fVar208 * 0.0;
    auVar223._12_4_ = fVar209 * 0.0;
    auVar148._0_4_ = auVar223._0_4_ + fVar271 + fVar247 + fVar65;
    auVar148._4_4_ = auVar223._4_4_ + fVar276 + fVar254 + fVar92;
    auVar148._8_4_ = auVar223._8_4_ + fVar277 + fVar255 + fVar93;
    auVar148._12_4_ = auVar223._12_4_ + fVar278 + fVar256 + fVar94;
    auVar231._0_4_ = fVar65 * 3.0;
    auVar231._4_4_ = fVar92 * 3.0;
    auVar231._8_4_ = fVar93 * 3.0;
    auVar231._12_4_ = fVar94 * 3.0;
    auVar159._0_4_ = *pfVar1 * 3.0;
    auVar159._4_4_ = pfVar1[1] * 3.0;
    auVar159._8_4_ = pfVar1[2] * 3.0;
    auVar159._12_4_ = pfVar1[3] * 3.0;
    auVar73 = vsubps_avx(auVar231,auVar159);
    auVar160._0_4_ = fVar271 + auVar73._0_4_;
    auVar160._4_4_ = fVar276 + auVar73._4_4_;
    auVar160._8_4_ = fVar277 + auVar73._8_4_;
    auVar160._12_4_ = fVar278 + auVar73._12_4_;
    auVar127 = vsubps_avx(auVar160,auVar223);
    auVar177._0_4_ = fVar174 * 0.0;
    auVar177._4_4_ = fVar144 * 0.0;
    auVar177._8_4_ = fVar190 * 0.0;
    auVar177._12_4_ = fVar154 * 0.0;
    auVar232._0_4_ = fVar292 + fVar284 + fVar191 + auVar177._0_4_;
    auVar232._4_4_ = fVar298 + fVar288 + fVar155 + auVar177._4_4_;
    auVar232._8_4_ = fVar299 + fVar289 + fVar192 + auVar177._8_4_;
    auVar232._12_4_ = fVar300 + fVar290 + fVar156 + auVar177._12_4_;
    auVar213._0_4_ = fVar191 * 3.0;
    auVar213._4_4_ = fVar155 * 3.0;
    auVar213._8_4_ = fVar192 * 3.0;
    auVar213._12_4_ = fVar156 * 3.0;
    auVar195._0_4_ = *pfVar5 * 3.0;
    auVar195._4_4_ = pfVar5[1] * 3.0;
    auVar195._8_4_ = pfVar5[2] * 3.0;
    auVar195._12_4_ = pfVar5[3] * 3.0;
    auVar73 = vsubps_avx(auVar213,auVar195);
    auVar196._0_4_ = fVar292 + auVar73._0_4_;
    auVar196._4_4_ = fVar298 + auVar73._4_4_;
    auVar196._8_4_ = fVar299 + auVar73._8_4_;
    auVar196._12_4_ = fVar300 + auVar73._12_4_;
    auVar66 = vsubps_avx(auVar196,auVar177);
    auVar73 = vshufps_avx(auVar99,auVar99,0xc9);
    auVar198 = vshufps_avx(auVar301,auVar301,0xc9);
    fVar257 = auVar99._0_4_;
    auVar214._0_4_ = fVar257 * auVar198._0_4_;
    fVar268 = auVar99._4_4_;
    auVar214._4_4_ = fVar268 * auVar198._4_4_;
    fVar269 = auVar99._8_4_;
    auVar214._8_4_ = fVar269 * auVar198._8_4_;
    fVar270 = auVar99._12_4_;
    auVar214._12_4_ = fVar270 * auVar198._12_4_;
    auVar224._0_4_ = auVar301._0_4_ * auVar73._0_4_;
    auVar224._4_4_ = auVar301._4_4_ * auVar73._4_4_;
    auVar224._8_4_ = auVar301._8_4_ * auVar73._8_4_;
    auVar224._12_4_ = auVar301._12_4_ * auVar73._12_4_;
    auVar198 = vsubps_avx(auVar224,auVar214);
    auVar15 = vshufps_avx(auVar198,auVar198,0xc9);
    auVar198 = vshufps_avx(auVar260,auVar260,0xc9);
    auVar215._0_4_ = fVar257 * auVar198._0_4_;
    auVar215._4_4_ = fVar268 * auVar198._4_4_;
    auVar215._8_4_ = fVar269 * auVar198._8_4_;
    auVar215._12_4_ = fVar270 * auVar198._12_4_;
    auVar178._0_4_ = auVar260._0_4_ * auVar73._0_4_;
    auVar178._4_4_ = auVar260._4_4_ * auVar73._4_4_;
    auVar178._8_4_ = auVar260._8_4_ * auVar73._8_4_;
    auVar178._12_4_ = auVar260._12_4_ * auVar73._12_4_;
    auVar73 = vsubps_avx(auVar178,auVar215);
    auVar260 = vshufps_avx(auVar73,auVar73,0xc9);
    auVar73 = vshufps_avx(auVar127,auVar127,0xc9);
    auVar198 = vshufps_avx(auVar232,auVar232,0xc9);
    fVar271 = auVar127._0_4_;
    auVar179._0_4_ = fVar271 * auVar198._0_4_;
    fVar276 = auVar127._4_4_;
    auVar179._4_4_ = fVar276 * auVar198._4_4_;
    fVar277 = auVar127._8_4_;
    auVar179._8_4_ = fVar277 * auVar198._8_4_;
    fVar278 = auVar127._12_4_;
    auVar179._12_4_ = fVar278 * auVar198._12_4_;
    auVar233._0_4_ = auVar232._0_4_ * auVar73._0_4_;
    auVar233._4_4_ = auVar232._4_4_ * auVar73._4_4_;
    auVar233._8_4_ = auVar232._8_4_ * auVar73._8_4_;
    auVar233._12_4_ = auVar232._12_4_ * auVar73._12_4_;
    auVar198 = vsubps_avx(auVar233,auVar179);
    auVar16 = vshufps_avx(auVar198,auVar198,0xc9);
    auVar198 = vshufps_avx(auVar66,auVar66,0xc9);
    auVar234._0_4_ = auVar198._0_4_ * fVar271;
    auVar234._4_4_ = auVar198._4_4_ * fVar276;
    auVar234._8_4_ = auVar198._8_4_ * fVar277;
    auVar234._12_4_ = auVar198._12_4_ * fVar278;
    auVar197._0_4_ = auVar73._0_4_ * auVar66._0_4_;
    auVar197._4_4_ = auVar73._4_4_ * auVar66._4_4_;
    auVar197._8_4_ = auVar73._8_4_ * auVar66._8_4_;
    auVar197._12_4_ = auVar73._12_4_ * auVar66._12_4_;
    auVar73 = vdpps_avx(auVar15,auVar15,0x7f);
    auVar198 = vsubps_avx(auVar197,auVar234);
    auVar66 = vshufps_avx(auVar198,auVar198,0xc9);
    fVar191 = auVar73._0_4_;
    auVar119 = ZEXT416((uint)fVar191);
    auVar198 = vrsqrtss_avx(auVar119,auVar119);
    fVar174 = auVar198._0_4_;
    auVar198 = ZEXT416((uint)(fVar174 * 1.5 - fVar191 * 0.5 * fVar174 * fVar174 * fVar174));
    auVar67 = vshufps_avx(auVar198,auVar198,0);
    fVar174 = auVar15._0_4_ * auVar67._0_4_;
    fVar144 = auVar15._4_4_ * auVar67._4_4_;
    fVar190 = auVar15._8_4_ * auVar67._8_4_;
    fVar154 = auVar15._12_4_ * auVar67._12_4_;
    auVar198 = vdpps_avx(auVar15,auVar260,0x7f);
    auVar73 = vshufps_avx(auVar73,auVar73,0);
    auVar248._0_4_ = auVar260._0_4_ * auVar73._0_4_;
    auVar248._4_4_ = auVar260._4_4_ * auVar73._4_4_;
    auVar248._8_4_ = auVar260._8_4_ * auVar73._8_4_;
    auVar248._12_4_ = auVar260._12_4_ * auVar73._12_4_;
    auVar73 = vshufps_avx(auVar198,auVar198,0);
    auVar225._0_4_ = auVar15._0_4_ * auVar73._0_4_;
    auVar225._4_4_ = auVar15._4_4_ * auVar73._4_4_;
    auVar225._8_4_ = auVar15._8_4_ * auVar73._8_4_;
    auVar225._12_4_ = auVar15._12_4_ * auVar73._12_4_;
    auVar100 = vsubps_avx(auVar248,auVar225);
    auVar73 = vrcpss_avx(auVar119,auVar119);
    auVar73 = ZEXT416((uint)(auVar73._0_4_ * (2.0 - fVar191 * auVar73._0_4_)));
    auVar15 = vshufps_avx(auVar73,auVar73,0);
    auVar73 = vdpps_avx(auVar16,auVar16,0x7f);
    fVar191 = auVar73._0_4_;
    auVar119 = ZEXT416((uint)fVar191);
    auVar198 = vrsqrtss_avx(auVar119,auVar119);
    fVar155 = auVar198._0_4_;
    auVar198 = vdpps_avx(auVar16,auVar66,0x7f);
    auVar260 = ZEXT416((uint)(fVar155 * 1.5 - fVar191 * 0.5 * fVar155 * fVar155 * fVar155));
    auVar260 = vshufps_avx(auVar260,auVar260,0);
    fVar155 = auVar260._0_4_ * auVar16._0_4_;
    fVar192 = auVar260._4_4_ * auVar16._4_4_;
    fVar156 = auVar260._8_4_ * auVar16._8_4_;
    fVar193 = auVar260._12_4_ * auVar16._12_4_;
    auVar73 = vshufps_avx(auVar73,auVar73,0);
    auVar216._0_4_ = auVar73._0_4_ * auVar66._0_4_;
    auVar216._4_4_ = auVar73._4_4_ * auVar66._4_4_;
    auVar216._8_4_ = auVar73._8_4_ * auVar66._8_4_;
    auVar216._12_4_ = auVar73._12_4_ * auVar66._12_4_;
    auVar73 = vshufps_avx(auVar198,auVar198,0);
    auVar180._0_4_ = auVar73._0_4_ * auVar16._0_4_;
    auVar180._4_4_ = auVar73._4_4_ * auVar16._4_4_;
    auVar180._8_4_ = auVar73._8_4_ * auVar16._8_4_;
    auVar180._12_4_ = auVar73._12_4_ * auVar16._12_4_;
    auVar66 = vsubps_avx(auVar216,auVar180);
    auVar73 = vrcpss_avx(auVar119,auVar119);
    auVar73 = ZEXT416((uint)((2.0 - fVar191 * auVar73._0_4_) * auVar73._0_4_));
    auVar73 = vshufps_avx(auVar73,auVar73,0);
    auVar198 = vshufps_avx(_local_5c8,_local_5c8,0xff);
    auVar235._0_4_ = auVar198._0_4_ * fVar174;
    auVar235._4_4_ = auVar198._4_4_ * fVar144;
    auVar235._8_4_ = auVar198._8_4_ * fVar190;
    auVar235._12_4_ = auVar198._12_4_ * fVar154;
    _local_3d8 = vsubps_avx(_local_5c8,auVar235);
    auVar16 = vshufps_avx(auVar99,auVar99,0xff);
    auVar199._0_4_ =
         auVar16._0_4_ * fVar174 + auVar67._0_4_ * auVar100._0_4_ * auVar15._0_4_ * auVar198._0_4_;
    auVar199._4_4_ =
         auVar16._4_4_ * fVar144 + auVar67._4_4_ * auVar100._4_4_ * auVar15._4_4_ * auVar198._4_4_;
    auVar199._8_4_ =
         auVar16._8_4_ * fVar190 + auVar67._8_4_ * auVar100._8_4_ * auVar15._8_4_ * auVar198._8_4_;
    auVar199._12_4_ =
         auVar16._12_4_ * fVar154 +
         auVar67._12_4_ * auVar100._12_4_ * auVar15._12_4_ * auVar198._12_4_;
    auVar16 = vsubps_avx(auVar99,auVar199);
    local_3e8._0_4_ = auVar235._0_4_ + (float)local_5c8._0_4_;
    local_3e8._4_4_ = auVar235._4_4_ + (float)local_5c8._4_4_;
    fStack_3e0 = auVar235._8_4_ + fStack_5c0;
    fStack_3dc = auVar235._12_4_ + fStack_5bc;
    auVar198 = vshufps_avx(auVar148,auVar148,0xff);
    auVar123._0_4_ = fVar155 * auVar198._0_4_;
    auVar123._4_4_ = fVar192 * auVar198._4_4_;
    auVar123._8_4_ = fVar156 * auVar198._8_4_;
    auVar123._12_4_ = fVar193 * auVar198._12_4_;
    _local_3f8 = vsubps_avx(auVar148,auVar123);
    auVar15 = vshufps_avx(auVar127,auVar127,0xff);
    auVar95._0_4_ =
         fVar155 * auVar15._0_4_ + auVar198._0_4_ * auVar260._0_4_ * auVar66._0_4_ * auVar73._0_4_;
    auVar95._4_4_ =
         fVar192 * auVar15._4_4_ + auVar198._4_4_ * auVar260._4_4_ * auVar66._4_4_ * auVar73._4_4_;
    auVar95._8_4_ =
         fVar156 * auVar15._8_4_ + auVar198._8_4_ * auVar260._8_4_ * auVar66._8_4_ * auVar73._8_4_;
    auVar95._12_4_ =
         fVar193 * auVar15._12_4_ +
         auVar198._12_4_ * auVar260._12_4_ * auVar66._12_4_ * auVar73._12_4_;
    auVar260 = vsubps_avx(auVar127,auVar95);
    fVar65 = auVar148._0_4_ + auVar123._0_4_;
    fVar92 = auVar148._4_4_ + auVar123._4_4_;
    fVar93 = auVar148._8_4_ + auVar123._8_4_;
    fVar94 = auVar148._12_4_ + auVar123._12_4_;
    local_408._0_4_ = local_3d8._0_4_ + auVar16._0_4_ * 0.33333334;
    local_408._4_4_ = local_3d8._4_4_ + auVar16._4_4_ * 0.33333334;
    fStack_400 = local_3d8._8_4_ + auVar16._8_4_ * 0.33333334;
    fStack_3fc = local_3d8._12_4_ + auVar16._12_4_ * 0.33333334;
    local_298 = vsubps_avx(_local_3d8,auVar141);
    auVar198 = vmovsldup_avx(local_298);
    auVar73 = vmovshdup_avx(local_298);
    auVar15 = vshufps_avx(local_298,local_298,0xaa);
    fVar174 = pre->ray_space[k].vx.field_0.m128[0];
    fVar144 = pre->ray_space[k].vx.field_0.m128[1];
    fVar190 = pre->ray_space[k].vx.field_0.m128[2];
    fVar154 = pre->ray_space[k].vx.field_0.m128[3];
    fVar191 = pre->ray_space[k].vy.field_0.m128[0];
    fVar155 = pre->ray_space[k].vy.field_0.m128[1];
    fVar192 = pre->ray_space[k].vy.field_0.m128[2];
    fVar156 = pre->ray_space[k].vy.field_0.m128[3];
    fVar193 = pre->ray_space[k].vz.field_0.m128[0];
    fVar207 = pre->ray_space[k].vz.field_0.m128[1];
    fVar208 = pre->ray_space[k].vz.field_0.m128[2];
    fVar209 = pre->ray_space[k].vz.field_0.m128[3];
    fVar247 = fVar174 * auVar198._0_4_ + auVar15._0_4_ * fVar193 + fVar191 * auVar73._0_4_;
    fVar255 = fVar144 * auVar198._4_4_ + auVar15._4_4_ * fVar207 + fVar155 * auVar73._4_4_;
    local_5c8._4_4_ = fVar255;
    local_5c8._0_4_ = fVar247;
    fStack_5c0 = fVar190 * auVar198._8_4_ + auVar15._8_4_ * fVar208 + fVar192 * auVar73._8_4_;
    fStack_5bc = fVar154 * auVar198._12_4_ + auVar15._12_4_ * fVar209 + fVar156 * auVar73._12_4_;
    local_2a8 = vsubps_avx(_local_408,auVar141);
    auVar15 = vshufps_avx(local_2a8,local_2a8,0xaa);
    auVar73 = vmovshdup_avx(local_2a8);
    auVar198 = vmovsldup_avx(local_2a8);
    fVar254 = auVar198._0_4_ * fVar174 + auVar73._0_4_ * fVar191 + fVar193 * auVar15._0_4_;
    fVar256 = auVar198._4_4_ * fVar144 + auVar73._4_4_ * fVar155 + fVar207 * auVar15._4_4_;
    local_4a8._4_4_ = fVar256;
    local_4a8._0_4_ = fVar254;
    fStack_4a0 = auVar198._8_4_ * fVar190 + auVar73._8_4_ * fVar192 + fVar208 * auVar15._8_4_;
    fStack_49c = auVar198._12_4_ * fVar154 + auVar73._12_4_ * fVar156 + fVar209 * auVar15._12_4_;
    auVar181._0_4_ = auVar260._0_4_ * 0.33333334;
    auVar181._4_4_ = auVar260._4_4_ * 0.33333334;
    auVar181._8_4_ = auVar260._8_4_ * 0.33333334;
    auVar181._12_4_ = auVar260._12_4_ * 0.33333334;
    _local_418 = vsubps_avx(_local_3f8,auVar181);
    local_2b8 = vsubps_avx(_local_418,auVar141);
    auVar15 = vshufps_avx(local_2b8,local_2b8,0xaa);
    auVar73 = vmovshdup_avx(local_2b8);
    auVar198 = vmovsldup_avx(local_2b8);
    auVar302._0_4_ = auVar198._0_4_ * fVar174 + auVar73._0_4_ * fVar191 + fVar193 * auVar15._0_4_;
    auVar302._4_4_ = auVar198._4_4_ * fVar144 + auVar73._4_4_ * fVar155 + fVar207 * auVar15._4_4_;
    auVar302._8_4_ = auVar198._8_4_ * fVar190 + auVar73._8_4_ * fVar192 + fVar208 * auVar15._8_4_;
    auVar302._12_4_ =
         auVar198._12_4_ * fVar154 + auVar73._12_4_ * fVar156 + fVar209 * auVar15._12_4_;
    local_2c8 = vsubps_avx(_local_3f8,auVar141);
    auVar15 = vshufps_avx(local_2c8,local_2c8,0xaa);
    auVar73 = vmovshdup_avx(local_2c8);
    auVar198 = vmovsldup_avx(local_2c8);
    auVar293._0_4_ = auVar198._0_4_ * fVar174 + auVar73._0_4_ * fVar191 + auVar15._0_4_ * fVar193;
    auVar293._4_4_ = auVar198._4_4_ * fVar144 + auVar73._4_4_ * fVar155 + auVar15._4_4_ * fVar207;
    auVar293._8_4_ = auVar198._8_4_ * fVar190 + auVar73._8_4_ * fVar192 + auVar15._8_4_ * fVar208;
    auVar293._12_4_ =
         auVar198._12_4_ * fVar154 + auVar73._12_4_ * fVar156 + auVar15._12_4_ * fVar209;
    local_2d8 = vsubps_avx(_local_3e8,auVar141);
    auVar15 = vshufps_avx(local_2d8,local_2d8,0xaa);
    auVar73 = vmovshdup_avx(local_2d8);
    auVar198 = vmovsldup_avx(local_2d8);
    auVar286._0_4_ = auVar198._0_4_ * fVar174 + auVar73._0_4_ * fVar191 + auVar15._0_4_ * fVar193;
    auVar286._4_4_ = auVar198._4_4_ * fVar144 + auVar73._4_4_ * fVar155 + auVar15._4_4_ * fVar207;
    auVar286._8_4_ = auVar198._8_4_ * fVar190 + auVar73._8_4_ * fVar192 + auVar15._8_4_ * fVar208;
    auVar286._12_4_ =
         auVar198._12_4_ * fVar154 + auVar73._12_4_ * fVar156 + auVar15._12_4_ * fVar209;
    local_428._0_4_ = (float)local_3e8._0_4_ + (fVar257 + auVar199._0_4_) * 0.33333334;
    local_428._4_4_ = (float)local_3e8._4_4_ + (fVar268 + auVar199._4_4_) * 0.33333334;
    fStack_420 = fStack_3e0 + (fVar269 + auVar199._8_4_) * 0.33333334;
    fStack_41c = fStack_3dc + (fVar270 + auVar199._12_4_) * 0.33333334;
    local_2e8 = vsubps_avx(_local_428,auVar141);
    auVar15 = vshufps_avx(local_2e8,local_2e8,0xaa);
    auVar73 = vmovshdup_avx(local_2e8);
    auVar198 = vmovsldup_avx(local_2e8);
    auVar249._0_4_ = auVar198._0_4_ * fVar174 + auVar73._0_4_ * fVar191 + auVar15._0_4_ * fVar193;
    auVar249._4_4_ = auVar198._4_4_ * fVar144 + auVar73._4_4_ * fVar155 + auVar15._4_4_ * fVar207;
    auVar249._8_4_ = auVar198._8_4_ * fVar190 + auVar73._8_4_ * fVar192 + auVar15._8_4_ * fVar208;
    auVar249._12_4_ =
         auVar198._12_4_ * fVar154 + auVar73._12_4_ * fVar156 + auVar15._12_4_ * fVar209;
    auVar217._0_4_ = (fVar271 + auVar95._0_4_) * 0.33333334;
    auVar217._4_4_ = (fVar276 + auVar95._4_4_) * 0.33333334;
    auVar217._8_4_ = (fVar277 + auVar95._8_4_) * 0.33333334;
    auVar217._12_4_ = (fVar278 + auVar95._12_4_) * 0.33333334;
    auVar55._4_4_ = fVar92;
    auVar55._0_4_ = fVar65;
    auVar55._8_4_ = fVar93;
    auVar55._12_4_ = fVar94;
    _local_328 = vsubps_avx(auVar55,auVar217);
    local_2f8 = vsubps_avx(_local_328,auVar141);
    auVar15 = vshufps_avx(local_2f8,local_2f8,0xaa);
    auVar73 = vmovshdup_avx(local_2f8);
    auVar198 = vmovsldup_avx(local_2f8);
    auVar96._0_4_ = auVar198._0_4_ * fVar174 + auVar73._0_4_ * fVar191 + fVar193 * auVar15._0_4_;
    auVar96._4_4_ = auVar198._4_4_ * fVar144 + auVar73._4_4_ * fVar155 + fVar207 * auVar15._4_4_;
    auVar96._8_4_ = auVar198._8_4_ * fVar190 + auVar73._8_4_ * fVar192 + fVar208 * auVar15._8_4_;
    auVar96._12_4_ = auVar198._12_4_ * fVar154 + auVar73._12_4_ * fVar156 + fVar209 * auVar15._12_4_
    ;
    local_308 = vsubps_avx(auVar55,auVar141);
    auVar141 = vshufps_avx(local_308,local_308,0xaa);
    auVar73 = vmovshdup_avx(local_308);
    auVar198 = vmovsldup_avx(local_308);
    auVar68._0_4_ = fVar174 * auVar198._0_4_ + fVar191 * auVar73._0_4_ + fVar193 * auVar141._0_4_;
    auVar68._4_4_ = fVar144 * auVar198._4_4_ + fVar155 * auVar73._4_4_ + fVar207 * auVar141._4_4_;
    auVar68._8_4_ = fVar190 * auVar198._8_4_ + fVar192 * auVar73._8_4_ + fVar208 * auVar141._8_4_;
    auVar68._12_4_ =
         fVar154 * auVar198._12_4_ + fVar156 * auVar73._12_4_ + fVar209 * auVar141._12_4_;
    auVar15 = vmovlhps_avx(_local_5c8,auVar286);
    auVar260 = vmovlhps_avx(_local_4a8,auVar249);
    auVar16 = vmovlhps_avx(auVar302,auVar96);
    auVar66 = vmovlhps_avx(auVar293,auVar68);
    auVar73 = vminps_avx(auVar15,auVar260);
    auVar198 = vminps_avx(auVar16,auVar66);
    auVar141 = vminps_avx(auVar73,auVar198);
    auVar73 = vmaxps_avx(auVar15,auVar260);
    auVar198 = vmaxps_avx(auVar16,auVar66);
    auVar73 = vmaxps_avx(auVar73,auVar198);
    auVar198 = vshufpd_avx(auVar141,auVar141,3);
    auVar141 = vminps_avx(auVar141,auVar198);
    auVar198 = vshufpd_avx(auVar73,auVar73,3);
    auVar198 = vmaxps_avx(auVar73,auVar198);
    auVar200._8_4_ = 0x7fffffff;
    auVar200._0_8_ = 0x7fffffff7fffffff;
    auVar200._12_4_ = 0x7fffffff;
    auVar73 = vandps_avx(auVar141,auVar200);
    auVar198 = vandps_avx(auVar198,auVar200);
    auVar73 = vmaxps_avx(auVar73,auVar198);
    auVar198 = vmovshdup_avx(auVar73);
    auVar73 = vmaxss_avx(auVar198,auVar73);
    fVar174 = auVar73._0_4_ * 9.536743e-07;
    local_258 = ZEXT416((uint)fVar174);
    auVar73 = vshufps_avx(ZEXT416((uint)fVar174),ZEXT416((uint)fVar174),0);
    local_228._16_16_ = auVar73;
    local_228._0_16_ = auVar73;
    auVar69._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
    auVar69._8_4_ = auVar73._8_4_ ^ 0x80000000;
    auVar69._12_4_ = auVar73._12_4_ ^ 0x80000000;
    local_248._16_16_ = auVar69;
    local_248._0_16_ = auVar69;
    local_388 = vpshufd_avx(ZEXT416(uVar57),0);
    local_398 = vpshufd_avx(ZEXT416(uVar9),0);
    uVar61 = 0;
    fVar174 = *(float *)(ray + k * 4 + 0x30);
    _local_268 = vsubps_avx(auVar260,auVar15);
    _local_278 = vsubps_avx(auVar16,auVar260);
    _local_288 = vsubps_avx(auVar66,auVar16);
    _local_338 = vsubps_avx(_local_3e8,_local_3d8);
    _local_348 = vsubps_avx(_local_428,_local_408);
    _local_358 = vsubps_avx(_local_328,_local_418);
    auVar56._4_4_ = fVar92;
    auVar56._0_4_ = fVar65;
    auVar56._8_4_ = fVar93;
    auVar56._12_4_ = fVar94;
    _local_368 = vsubps_avx(auVar56,_local_3f8);
    auVar267 = ZEXT1664(ZEXT816(0x3f80000000000000));
    auVar275 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_00e0b505:
    auVar121 = auVar267._0_16_;
    auVar145 = auVar275._0_16_;
    local_318 = auVar145;
    auVar73 = vshufps_avx(auVar121,auVar121,0x50);
    auVar294._8_4_ = 0x3f800000;
    auVar294._0_8_ = 0x3f8000003f800000;
    auVar294._12_4_ = 0x3f800000;
    auVar297._16_4_ = 0x3f800000;
    auVar297._0_16_ = auVar294;
    auVar297._20_4_ = 0x3f800000;
    auVar297._24_4_ = 0x3f800000;
    auVar297._28_4_ = 0x3f800000;
    auVar198 = vsubps_avx(auVar294,auVar73);
    fVar144 = auVar73._0_4_;
    fVar190 = auVar73._4_4_;
    fVar154 = auVar73._8_4_;
    fVar191 = auVar73._12_4_;
    fVar155 = auVar198._0_4_;
    fVar192 = auVar198._4_4_;
    fVar156 = auVar198._8_4_;
    fVar193 = auVar198._12_4_;
    auVar149._0_4_ = auVar286._0_4_ * fVar144 + fVar155 * fVar247;
    auVar149._4_4_ = auVar286._4_4_ * fVar190 + fVar192 * fVar255;
    auVar149._8_4_ = auVar286._0_4_ * fVar154 + fVar156 * fVar247;
    auVar149._12_4_ = auVar286._4_4_ * fVar191 + fVar193 * fVar255;
    auVar124._0_4_ = auVar249._0_4_ * fVar144 + fVar155 * fVar254;
    auVar124._4_4_ = auVar249._4_4_ * fVar190 + fVar192 * fVar256;
    auVar124._8_4_ = auVar249._0_4_ * fVar154 + fVar156 * fVar254;
    auVar124._12_4_ = auVar249._4_4_ * fVar191 + fVar193 * fVar256;
    auVar218._0_4_ = auVar96._0_4_ * fVar144 + auVar302._0_4_ * fVar155;
    auVar218._4_4_ = auVar96._4_4_ * fVar190 + auVar302._4_4_ * fVar192;
    auVar218._8_4_ = auVar96._0_4_ * fVar154 + auVar302._0_4_ * fVar156;
    auVar218._12_4_ = auVar96._4_4_ * fVar191 + auVar302._4_4_ * fVar193;
    auVar161._0_4_ = auVar68._0_4_ * fVar144 + auVar293._0_4_ * fVar155;
    auVar161._4_4_ = auVar68._4_4_ * fVar190 + auVar293._4_4_ * fVar192;
    auVar161._8_4_ = auVar68._0_4_ * fVar154 + auVar293._0_4_ * fVar156;
    auVar161._12_4_ = auVar68._4_4_ * fVar191 + auVar293._4_4_ * fVar193;
    auVar73 = vmovshdup_avx(auVar145);
    auVar198 = vshufps_avx(auVar145,auVar145,0);
    auVar239._16_16_ = auVar198;
    auVar239._0_16_ = auVar198;
    auVar141 = vshufps_avx(auVar145,auVar145,0x55);
    auVar87._16_16_ = auVar141;
    auVar87._0_16_ = auVar141;
    auVar86 = vsubps_avx(auVar87,auVar239);
    auVar141 = vshufps_avx(auVar149,auVar149,0);
    auVar67 = vshufps_avx(auVar149,auVar149,0x55);
    auVar99 = vshufps_avx(auVar124,auVar124,0);
    auVar127 = vshufps_avx(auVar124,auVar124,0x55);
    auVar100 = vshufps_avx(auVar218,auVar218,0);
    auVar119 = vshufps_avx(auVar218,auVar218,0x55);
    auVar118 = vshufps_avx(auVar161,auVar161,0);
    auVar120 = vshufps_avx(auVar161,auVar161,0x55);
    auVar73 = ZEXT416((uint)((auVar73._0_4_ - auVar275._0_4_) * 0.04761905));
    auVar73 = vshufps_avx(auVar73,auVar73,0);
    auVar253._0_4_ = auVar198._0_4_ + auVar86._0_4_ * 0.0;
    auVar253._4_4_ = auVar198._4_4_ + auVar86._4_4_ * 0.14285715;
    auVar253._8_4_ = auVar198._8_4_ + auVar86._8_4_ * 0.2857143;
    auVar253._12_4_ = auVar198._12_4_ + auVar86._12_4_ * 0.42857146;
    auVar253._16_4_ = auVar198._0_4_ + auVar86._16_4_ * 0.5714286;
    auVar253._20_4_ = auVar198._4_4_ + auVar86._20_4_ * 0.71428573;
    auVar253._24_4_ = auVar198._8_4_ + auVar86._24_4_ * 0.8571429;
    auVar253._28_4_ = auVar198._12_4_ + auVar86._28_4_;
    auVar17 = vsubps_avx(auVar297,auVar253);
    fVar144 = auVar99._0_4_;
    fVar154 = auVar99._4_4_;
    fVar155 = auVar99._8_4_;
    fVar156 = auVar99._12_4_;
    fVar229 = auVar17._0_4_;
    fVar241 = auVar17._4_4_;
    fVar242 = auVar17._8_4_;
    fVar243 = auVar17._12_4_;
    fVar244 = auVar17._16_4_;
    fVar245 = auVar17._20_4_;
    fVar246 = auVar17._24_4_;
    fVar288 = auVar127._0_4_;
    fVar290 = auVar127._4_4_;
    fVar298 = auVar127._8_4_;
    fVar300 = auVar127._12_4_;
    fVar291 = auVar67._12_4_ + 1.0;
    fVar276 = auVar100._0_4_;
    fVar277 = auVar100._4_4_;
    fVar278 = auVar100._8_4_;
    fVar284 = auVar100._12_4_;
    fVar207 = fVar276 * auVar253._0_4_ + fVar229 * fVar144;
    fVar208 = fVar277 * auVar253._4_4_ + fVar241 * fVar154;
    fVar209 = fVar278 * auVar253._8_4_ + fVar242 * fVar155;
    fVar257 = fVar284 * auVar253._12_4_ + fVar243 * fVar156;
    fVar268 = fVar276 * auVar253._16_4_ + fVar244 * fVar144;
    fVar269 = fVar277 * auVar253._20_4_ + fVar245 * fVar154;
    fVar270 = fVar278 * auVar253._24_4_ + fVar246 * fVar155;
    fVar190 = auVar119._0_4_;
    fVar191 = auVar119._4_4_;
    fVar192 = auVar119._8_4_;
    fVar193 = auVar119._12_4_;
    fVar289 = fVar288 * fVar229 + auVar253._0_4_ * fVar190;
    fVar292 = fVar290 * fVar241 + auVar253._4_4_ * fVar191;
    fVar299 = fVar298 * fVar242 + auVar253._8_4_ * fVar192;
    fVar279 = fVar300 * fVar243 + auVar253._12_4_ * fVar193;
    fVar280 = fVar288 * fVar244 + auVar253._16_4_ * fVar190;
    fVar281 = fVar290 * fVar245 + auVar253._20_4_ * fVar191;
    fVar282 = fVar298 * fVar246 + auVar253._24_4_ * fVar192;
    fVar283 = fVar300 + fVar156;
    auVar198 = vshufps_avx(auVar149,auVar149,0xaa);
    auVar99 = vshufps_avx(auVar149,auVar149,0xff);
    fVar271 = fVar284 + 0.0;
    auVar127 = vshufps_avx(auVar124,auVar124,0xaa);
    auVar100 = vshufps_avx(auVar124,auVar124,0xff);
    auVar172._0_4_ =
         fVar229 * (auVar253._0_4_ * fVar144 + fVar229 * auVar141._0_4_) + auVar253._0_4_ * fVar207;
    auVar172._4_4_ =
         fVar241 * (auVar253._4_4_ * fVar154 + fVar241 * auVar141._4_4_) + auVar253._4_4_ * fVar208;
    auVar172._8_4_ =
         fVar242 * (auVar253._8_4_ * fVar155 + fVar242 * auVar141._8_4_) + auVar253._8_4_ * fVar209;
    auVar172._12_4_ =
         fVar243 * (auVar253._12_4_ * fVar156 + fVar243 * auVar141._12_4_) +
         auVar253._12_4_ * fVar257;
    auVar172._16_4_ =
         fVar244 * (auVar253._16_4_ * fVar144 + fVar244 * auVar141._0_4_) +
         auVar253._16_4_ * fVar268;
    auVar172._20_4_ =
         fVar245 * (auVar253._20_4_ * fVar154 + fVar245 * auVar141._4_4_) +
         auVar253._20_4_ * fVar269;
    auVar172._24_4_ =
         fVar246 * (auVar253._24_4_ * fVar155 + fVar246 * auVar141._8_4_) +
         auVar253._24_4_ * fVar270;
    auVar172._28_4_ = auVar141._12_4_ + 1.0 + fVar193;
    auVar188._0_4_ =
         fVar229 * (fVar288 * auVar253._0_4_ + auVar67._0_4_ * fVar229) + auVar253._0_4_ * fVar289;
    auVar188._4_4_ =
         fVar241 * (fVar290 * auVar253._4_4_ + auVar67._4_4_ * fVar241) + auVar253._4_4_ * fVar292;
    auVar188._8_4_ =
         fVar242 * (fVar298 * auVar253._8_4_ + auVar67._8_4_ * fVar242) + auVar253._8_4_ * fVar299;
    auVar188._12_4_ =
         fVar243 * (fVar300 * auVar253._12_4_ + auVar67._12_4_ * fVar243) +
         auVar253._12_4_ * fVar279;
    auVar188._16_4_ =
         fVar244 * (fVar288 * auVar253._16_4_ + auVar67._0_4_ * fVar244) + auVar253._16_4_ * fVar280
    ;
    auVar188._20_4_ =
         fVar245 * (fVar290 * auVar253._20_4_ + auVar67._4_4_ * fVar245) + auVar253._20_4_ * fVar281
    ;
    auVar188._24_4_ =
         fVar246 * (fVar298 * auVar253._24_4_ + auVar67._8_4_ * fVar246) + auVar253._24_4_ * fVar282
    ;
    auVar188._28_4_ = auVar120._12_4_ + fVar193;
    auVar88._0_4_ =
         fVar229 * fVar207 + auVar253._0_4_ * (fVar276 * fVar229 + auVar118._0_4_ * auVar253._0_4_);
    auVar88._4_4_ =
         fVar241 * fVar208 + auVar253._4_4_ * (fVar277 * fVar241 + auVar118._4_4_ * auVar253._4_4_);
    auVar88._8_4_ =
         fVar242 * fVar209 + auVar253._8_4_ * (fVar278 * fVar242 + auVar118._8_4_ * auVar253._8_4_);
    auVar88._12_4_ =
         fVar243 * fVar257 +
         auVar253._12_4_ * (fVar284 * fVar243 + auVar118._12_4_ * auVar253._12_4_);
    auVar88._16_4_ =
         fVar244 * fVar268 +
         auVar253._16_4_ * (fVar276 * fVar244 + auVar118._0_4_ * auVar253._16_4_);
    auVar88._20_4_ =
         fVar245 * fVar269 +
         auVar253._20_4_ * (fVar277 * fVar245 + auVar118._4_4_ * auVar253._20_4_);
    auVar88._24_4_ =
         fVar246 * fVar270 +
         auVar253._24_4_ * (fVar278 * fVar246 + auVar118._8_4_ * auVar253._24_4_);
    auVar88._28_4_ = fVar156 + 1.0 + fVar271;
    auVar266._0_4_ =
         fVar229 * fVar289 + auVar253._0_4_ * (auVar120._0_4_ * auVar253._0_4_ + fVar229 * fVar190);
    auVar266._4_4_ =
         fVar241 * fVar292 + auVar253._4_4_ * (auVar120._4_4_ * auVar253._4_4_ + fVar241 * fVar191);
    auVar266._8_4_ =
         fVar242 * fVar299 + auVar253._8_4_ * (auVar120._8_4_ * auVar253._8_4_ + fVar242 * fVar192);
    auVar266._12_4_ =
         fVar243 * fVar279 +
         auVar253._12_4_ * (auVar120._12_4_ * auVar253._12_4_ + fVar243 * fVar193);
    auVar266._16_4_ =
         fVar244 * fVar280 +
         auVar253._16_4_ * (auVar120._0_4_ * auVar253._16_4_ + fVar244 * fVar190);
    auVar266._20_4_ =
         fVar245 * fVar281 +
         auVar253._20_4_ * (auVar120._4_4_ * auVar253._20_4_ + fVar245 * fVar191);
    auVar266._24_4_ =
         fVar246 * fVar282 +
         auVar253._24_4_ * (auVar120._8_4_ * auVar253._24_4_ + fVar246 * fVar192);
    auVar266._28_4_ = fVar271 + fVar193 + 0.0;
    local_98._0_4_ = fVar229 * auVar172._0_4_ + auVar253._0_4_ * auVar88._0_4_;
    local_98._4_4_ = fVar241 * auVar172._4_4_ + auVar253._4_4_ * auVar88._4_4_;
    local_98._8_4_ = fVar242 * auVar172._8_4_ + auVar253._8_4_ * auVar88._8_4_;
    local_98._12_4_ = fVar243 * auVar172._12_4_ + auVar253._12_4_ * auVar88._12_4_;
    local_98._16_4_ = fVar244 * auVar172._16_4_ + auVar253._16_4_ * auVar88._16_4_;
    local_98._20_4_ = fVar245 * auVar172._20_4_ + auVar253._20_4_ * auVar88._20_4_;
    local_98._24_4_ = fVar246 * auVar172._24_4_ + auVar253._24_4_ * auVar88._24_4_;
    local_98._28_4_ = fVar283 + fVar193 + 0.0;
    auVar153._0_4_ = fVar229 * auVar188._0_4_ + auVar253._0_4_ * auVar266._0_4_;
    auVar153._4_4_ = fVar241 * auVar188._4_4_ + auVar253._4_4_ * auVar266._4_4_;
    auVar153._8_4_ = fVar242 * auVar188._8_4_ + auVar253._8_4_ * auVar266._8_4_;
    auVar153._12_4_ = fVar243 * auVar188._12_4_ + auVar253._12_4_ * auVar266._12_4_;
    auVar153._16_4_ = fVar244 * auVar188._16_4_ + auVar253._16_4_ * auVar266._16_4_;
    auVar153._20_4_ = fVar245 * auVar188._20_4_ + auVar253._20_4_ * auVar266._20_4_;
    auVar153._24_4_ = fVar246 * auVar188._24_4_ + auVar253._24_4_ * auVar266._24_4_;
    auVar153._28_4_ = fVar283 + fVar271;
    auVar18 = vsubps_avx(auVar88,auVar172);
    auVar86 = vsubps_avx(auVar266,auVar188);
    local_4e8 = auVar73._0_4_;
    fStack_4e4 = auVar73._4_4_;
    fStack_4e0 = auVar73._8_4_;
    fStack_4dc = auVar73._12_4_;
    local_d8 = local_4e8 * auVar18._0_4_ * 3.0;
    fStack_d4 = fStack_4e4 * auVar18._4_4_ * 3.0;
    auVar19._4_4_ = fStack_d4;
    auVar19._0_4_ = local_d8;
    fStack_d0 = fStack_4e0 * auVar18._8_4_ * 3.0;
    auVar19._8_4_ = fStack_d0;
    fStack_cc = fStack_4dc * auVar18._12_4_ * 3.0;
    auVar19._12_4_ = fStack_cc;
    fStack_c8 = local_4e8 * auVar18._16_4_ * 3.0;
    auVar19._16_4_ = fStack_c8;
    fStack_c4 = fStack_4e4 * auVar18._20_4_ * 3.0;
    auVar19._20_4_ = fStack_c4;
    fStack_c0 = fStack_4e0 * auVar18._24_4_ * 3.0;
    auVar19._24_4_ = fStack_c0;
    auVar19._28_4_ = auVar18._28_4_;
    local_f8 = local_4e8 * auVar86._0_4_ * 3.0;
    fStack_f4 = fStack_4e4 * auVar86._4_4_ * 3.0;
    auVar20._4_4_ = fStack_f4;
    auVar20._0_4_ = local_f8;
    fStack_f0 = fStack_4e0 * auVar86._8_4_ * 3.0;
    auVar20._8_4_ = fStack_f0;
    fStack_ec = fStack_4dc * auVar86._12_4_ * 3.0;
    auVar20._12_4_ = fStack_ec;
    fStack_e8 = local_4e8 * auVar86._16_4_ * 3.0;
    auVar20._16_4_ = fStack_e8;
    fStack_e4 = fStack_4e4 * auVar86._20_4_ * 3.0;
    auVar20._20_4_ = fStack_e4;
    fStack_e0 = fStack_4e0 * auVar86._24_4_ * 3.0;
    auVar20._24_4_ = fStack_e0;
    auVar20._28_4_ = fVar283;
    auVar19 = vsubps_avx(local_98,auVar19);
    auVar86 = vperm2f128_avx(auVar19,auVar19,1);
    auVar86 = vshufps_avx(auVar86,auVar19,0x30);
    auVar86 = vshufps_avx(auVar19,auVar86,0x29);
    auVar20 = vsubps_avx(auVar153,auVar20);
    auVar19 = vperm2f128_avx(auVar20,auVar20,1);
    auVar19 = vshufps_avx(auVar19,auVar20,0x30);
    auVar20 = vshufps_avx(auVar20,auVar19,0x29);
    fVar281 = auVar127._0_4_;
    fVar282 = auVar127._4_4_;
    fVar304 = auVar127._8_4_;
    fVar156 = auVar198._12_4_;
    fVar277 = auVar100._0_4_;
    fVar284 = auVar100._4_4_;
    fVar289 = auVar100._8_4_;
    fVar292 = auVar100._12_4_;
    auVar73 = vshufps_avx(auVar218,auVar218,0xaa);
    fVar144 = auVar73._0_4_;
    fVar154 = auVar73._4_4_;
    fVar155 = auVar73._8_4_;
    fVar193 = auVar73._12_4_;
    fVar209 = auVar253._0_4_ * fVar144 + fVar281 * fVar229;
    fVar257 = auVar253._4_4_ * fVar154 + fVar282 * fVar241;
    fVar268 = auVar253._8_4_ * fVar155 + fVar304 * fVar242;
    fVar269 = auVar253._12_4_ * fVar193 + auVar127._12_4_ * fVar243;
    fVar270 = auVar253._16_4_ * fVar144 + fVar281 * fVar244;
    fVar271 = auVar253._20_4_ * fVar154 + fVar282 * fVar245;
    fVar276 = auVar253._24_4_ * fVar155 + fVar304 * fVar246;
    auVar73 = vshufps_avx(auVar218,auVar218,0xff);
    fVar190 = auVar73._0_4_;
    fVar191 = auVar73._4_4_;
    fVar192 = auVar73._8_4_;
    fVar207 = auVar73._12_4_;
    fVar278 = auVar253._0_4_ * fVar190 + fVar277 * fVar229;
    fVar288 = auVar253._4_4_ * fVar191 + fVar284 * fVar241;
    fVar290 = auVar253._8_4_ * fVar192 + fVar289 * fVar242;
    fVar298 = auVar253._12_4_ * fVar207 + fVar292 * fVar243;
    fVar299 = auVar253._16_4_ * fVar190 + fVar277 * fVar244;
    fVar300 = auVar253._20_4_ * fVar191 + fVar284 * fVar245;
    fVar279 = auVar253._24_4_ * fVar192 + fVar289 * fVar246;
    auVar73 = vshufps_avx(auVar161,auVar161,0xaa);
    fVar280 = auVar73._12_4_ + fVar193;
    auVar141 = vshufps_avx(auVar161,auVar161,0xff);
    fVar208 = auVar141._12_4_;
    auVar89._0_4_ =
         fVar229 * (fVar281 * auVar253._0_4_ + fVar229 * auVar198._0_4_) + auVar253._0_4_ * fVar209;
    auVar89._4_4_ =
         fVar241 * (fVar282 * auVar253._4_4_ + fVar241 * auVar198._4_4_) + auVar253._4_4_ * fVar257;
    auVar89._8_4_ =
         fVar242 * (fVar304 * auVar253._8_4_ + fVar242 * auVar198._8_4_) + auVar253._8_4_ * fVar268;
    auVar89._12_4_ =
         fVar243 * (auVar127._12_4_ * auVar253._12_4_ + fVar243 * fVar156) +
         auVar253._12_4_ * fVar269;
    auVar89._16_4_ =
         fVar244 * (fVar281 * auVar253._16_4_ + fVar244 * auVar198._0_4_) +
         auVar253._16_4_ * fVar270;
    auVar89._20_4_ =
         fVar245 * (fVar282 * auVar253._20_4_ + fVar245 * auVar198._4_4_) +
         auVar253._20_4_ * fVar271;
    auVar89._24_4_ =
         fVar246 * (fVar304 * auVar253._24_4_ + fVar246 * auVar198._8_4_) +
         auVar253._24_4_ * fVar276;
    auVar89._28_4_ = auVar20._28_4_ + fVar156 + fVar208;
    auVar114._0_4_ =
         fVar229 * (fVar277 * auVar253._0_4_ + auVar99._0_4_ * fVar229) + auVar253._0_4_ * fVar278;
    auVar114._4_4_ =
         fVar241 * (fVar284 * auVar253._4_4_ + auVar99._4_4_ * fVar241) + auVar253._4_4_ * fVar288;
    auVar114._8_4_ =
         fVar242 * (fVar289 * auVar253._8_4_ + auVar99._8_4_ * fVar242) + auVar253._8_4_ * fVar290;
    auVar114._12_4_ =
         fVar243 * (fVar292 * auVar253._12_4_ + auVar99._12_4_ * fVar243) +
         auVar253._12_4_ * fVar298;
    auVar114._16_4_ =
         fVar244 * (fVar277 * auVar253._16_4_ + auVar99._0_4_ * fVar244) + auVar253._16_4_ * fVar299
    ;
    auVar114._20_4_ =
         fVar245 * (fVar284 * auVar253._20_4_ + auVar99._4_4_ * fVar245) + auVar253._20_4_ * fVar300
    ;
    auVar114._24_4_ =
         fVar246 * (fVar289 * auVar253._24_4_ + auVar99._8_4_ * fVar246) + auVar253._24_4_ * fVar279
    ;
    auVar114._28_4_ = fVar156 + auVar19._28_4_ + fVar208;
    auVar19 = vperm2f128_avx(local_98,local_98,1);
    auVar19 = vshufps_avx(auVar19,local_98,0x30);
    _local_3c8 = vshufps_avx(local_98,auVar19,0x29);
    auVar189._0_4_ =
         auVar253._0_4_ * (auVar73._0_4_ * auVar253._0_4_ + fVar229 * fVar144) + fVar229 * fVar209;
    auVar189._4_4_ =
         auVar253._4_4_ * (auVar73._4_4_ * auVar253._4_4_ + fVar241 * fVar154) + fVar241 * fVar257;
    auVar189._8_4_ =
         auVar253._8_4_ * (auVar73._8_4_ * auVar253._8_4_ + fVar242 * fVar155) + fVar242 * fVar268;
    auVar189._12_4_ =
         auVar253._12_4_ * (auVar73._12_4_ * auVar253._12_4_ + fVar243 * fVar193) +
         fVar243 * fVar269;
    auVar189._16_4_ =
         auVar253._16_4_ * (auVar73._0_4_ * auVar253._16_4_ + fVar244 * fVar144) + fVar244 * fVar270
    ;
    auVar189._20_4_ =
         auVar253._20_4_ * (auVar73._4_4_ * auVar253._20_4_ + fVar245 * fVar154) + fVar245 * fVar271
    ;
    auVar189._24_4_ =
         auVar253._24_4_ * (auVar73._8_4_ * auVar253._24_4_ + fVar246 * fVar155) + fVar246 * fVar276
    ;
    auVar189._28_4_ = fVar280 + fVar291 + auVar188._28_4_;
    auVar228._0_4_ =
         fVar229 * fVar278 + auVar253._0_4_ * (auVar253._0_4_ * auVar141._0_4_ + fVar229 * fVar190);
    auVar228._4_4_ =
         fVar241 * fVar288 + auVar253._4_4_ * (auVar253._4_4_ * auVar141._4_4_ + fVar241 * fVar191);
    auVar228._8_4_ =
         fVar242 * fVar290 + auVar253._8_4_ * (auVar253._8_4_ * auVar141._8_4_ + fVar242 * fVar192);
    auVar228._12_4_ =
         fVar243 * fVar298 + auVar253._12_4_ * (auVar253._12_4_ * fVar208 + fVar243 * fVar207);
    auVar228._16_4_ =
         fVar244 * fVar299 +
         auVar253._16_4_ * (auVar253._16_4_ * auVar141._0_4_ + fVar244 * fVar190);
    auVar228._20_4_ =
         fVar245 * fVar300 +
         auVar253._20_4_ * (auVar253._20_4_ * auVar141._4_4_ + fVar245 * fVar191);
    auVar228._24_4_ =
         fVar246 * fVar279 +
         auVar253._24_4_ * (auVar253._24_4_ * auVar141._8_4_ + fVar246 * fVar192);
    auVar228._28_4_ = fVar291 + fVar292 + fVar208 + fVar207;
    auVar221._0_4_ = fVar229 * auVar89._0_4_ + auVar253._0_4_ * auVar189._0_4_;
    auVar221._4_4_ = fVar241 * auVar89._4_4_ + auVar253._4_4_ * auVar189._4_4_;
    auVar221._8_4_ = fVar242 * auVar89._8_4_ + auVar253._8_4_ * auVar189._8_4_;
    auVar221._12_4_ = fVar243 * auVar89._12_4_ + auVar253._12_4_ * auVar189._12_4_;
    auVar221._16_4_ = fVar244 * auVar89._16_4_ + auVar253._16_4_ * auVar189._16_4_;
    auVar221._20_4_ = fVar245 * auVar89._20_4_ + auVar253._20_4_ * auVar189._20_4_;
    auVar221._24_4_ = fVar246 * auVar89._24_4_ + auVar253._24_4_ * auVar189._24_4_;
    auVar221._28_4_ = fVar280 + fVar208 + fVar207;
    auVar240._0_4_ = fVar229 * auVar114._0_4_ + auVar253._0_4_ * auVar228._0_4_;
    auVar240._4_4_ = fVar241 * auVar114._4_4_ + auVar253._4_4_ * auVar228._4_4_;
    auVar240._8_4_ = fVar242 * auVar114._8_4_ + auVar253._8_4_ * auVar228._8_4_;
    auVar240._12_4_ = fVar243 * auVar114._12_4_ + auVar253._12_4_ * auVar228._12_4_;
    auVar240._16_4_ = fVar244 * auVar114._16_4_ + auVar253._16_4_ * auVar228._16_4_;
    auVar240._20_4_ = fVar245 * auVar114._20_4_ + auVar253._20_4_ * auVar228._20_4_;
    auVar240._24_4_ = fVar246 * auVar114._24_4_ + auVar253._24_4_ * auVar228._24_4_;
    auVar240._28_4_ = auVar17._28_4_ + auVar253._28_4_;
    auVar21 = vsubps_avx(auVar189,auVar89);
    auVar19 = vsubps_avx(auVar228,auVar114);
    local_118 = local_4e8 * auVar21._0_4_ * 3.0;
    fStack_114 = fStack_4e4 * auVar21._4_4_ * 3.0;
    auVar17._4_4_ = fStack_114;
    auVar17._0_4_ = local_118;
    fStack_110 = fStack_4e0 * auVar21._8_4_ * 3.0;
    auVar17._8_4_ = fStack_110;
    fStack_10c = fStack_4dc * auVar21._12_4_ * 3.0;
    auVar17._12_4_ = fStack_10c;
    fStack_108 = local_4e8 * auVar21._16_4_ * 3.0;
    auVar17._16_4_ = fStack_108;
    fStack_104 = fStack_4e4 * auVar21._20_4_ * 3.0;
    auVar17._20_4_ = fStack_104;
    fStack_100 = fStack_4e0 * auVar21._24_4_ * 3.0;
    auVar17._24_4_ = fStack_100;
    auVar17._28_4_ = auVar21._28_4_;
    local_138 = local_4e8 * auVar19._0_4_ * 3.0;
    fStack_134 = fStack_4e4 * auVar19._4_4_ * 3.0;
    auVar22._4_4_ = fStack_134;
    auVar22._0_4_ = local_138;
    fStack_130 = fStack_4e0 * auVar19._8_4_ * 3.0;
    auVar22._8_4_ = fStack_130;
    fStack_12c = fStack_4dc * auVar19._12_4_ * 3.0;
    auVar22._12_4_ = fStack_12c;
    fStack_128 = local_4e8 * auVar19._16_4_ * 3.0;
    auVar22._16_4_ = fStack_128;
    fStack_124 = fStack_4e4 * auVar19._20_4_ * 3.0;
    auVar22._20_4_ = fStack_124;
    fStack_120 = fStack_4e0 * auVar19._24_4_ * 3.0;
    auVar22._24_4_ = fStack_120;
    auVar22._28_4_ = auVar189._28_4_;
    auVar19 = vperm2f128_avx(auVar221,auVar221,1);
    auVar19 = vshufps_avx(auVar19,auVar221,0x30);
    auVar87 = vshufps_avx(auVar221,auVar19,0x29);
    auVar17 = vsubps_avx(auVar221,auVar17);
    auVar19 = vperm2f128_avx(auVar17,auVar17,1);
    auVar19 = vshufps_avx(auVar19,auVar17,0x30);
    auVar19 = vshufps_avx(auVar17,auVar19,0x29);
    auVar22 = vsubps_avx(auVar240,auVar22);
    auVar17 = vperm2f128_avx(auVar22,auVar22,1);
    auVar17 = vshufps_avx(auVar17,auVar22,0x30);
    auVar22 = vshufps_avx(auVar22,auVar17,0x29);
    auVar23 = vsubps_avx(auVar221,local_98);
    auVar88 = vsubps_avx(auVar87,_local_3c8);
    fVar144 = auVar88._0_4_ + auVar23._0_4_;
    fVar190 = auVar88._4_4_ + auVar23._4_4_;
    fVar154 = auVar88._8_4_ + auVar23._8_4_;
    fVar191 = auVar88._12_4_ + auVar23._12_4_;
    fVar155 = auVar88._16_4_ + auVar23._16_4_;
    fVar192 = auVar88._20_4_ + auVar23._20_4_;
    fVar156 = auVar88._24_4_ + auVar23._24_4_;
    auVar17 = vperm2f128_avx(auVar153,auVar153,1);
    auVar17 = vshufps_avx(auVar17,auVar153,0x30);
    local_b8 = vshufps_avx(auVar153,auVar17,0x29);
    auVar17 = vperm2f128_avx(auVar240,auVar240,1);
    auVar17 = vshufps_avx(auVar17,auVar240,0x30);
    local_78 = vshufps_avx(auVar240,auVar17,0x29);
    auVar17 = vsubps_avx(auVar240,auVar153);
    auVar89 = vsubps_avx(local_78,local_b8);
    fVar193 = auVar89._0_4_ + auVar17._0_4_;
    fVar207 = auVar89._4_4_ + auVar17._4_4_;
    fVar208 = auVar89._8_4_ + auVar17._8_4_;
    fVar209 = auVar89._12_4_ + auVar17._12_4_;
    fVar257 = auVar89._16_4_ + auVar17._16_4_;
    fVar268 = auVar89._20_4_ + auVar17._20_4_;
    fVar269 = auVar89._24_4_ + auVar17._24_4_;
    auVar24._4_4_ = fVar190 * auVar153._4_4_;
    auVar24._0_4_ = fVar144 * auVar153._0_4_;
    auVar24._8_4_ = fVar154 * auVar153._8_4_;
    auVar24._12_4_ = fVar191 * auVar153._12_4_;
    auVar24._16_4_ = fVar155 * auVar153._16_4_;
    auVar24._20_4_ = fVar192 * auVar153._20_4_;
    auVar24._24_4_ = fVar156 * auVar153._24_4_;
    auVar24._28_4_ = auVar17._28_4_;
    auVar25._4_4_ = fVar207 * local_98._4_4_;
    auVar25._0_4_ = fVar193 * local_98._0_4_;
    auVar25._8_4_ = fVar208 * local_98._8_4_;
    auVar25._12_4_ = fVar209 * local_98._12_4_;
    auVar25._16_4_ = fVar257 * local_98._16_4_;
    auVar25._20_4_ = fVar268 * local_98._20_4_;
    auVar25._24_4_ = fVar269 * local_98._24_4_;
    auVar25._28_4_ = fVar280;
    auVar24 = vsubps_avx(auVar24,auVar25);
    local_d8 = local_98._0_4_ + local_d8;
    fStack_d4 = local_98._4_4_ + fStack_d4;
    fStack_d0 = local_98._8_4_ + fStack_d0;
    fStack_cc = local_98._12_4_ + fStack_cc;
    fStack_c8 = local_98._16_4_ + fStack_c8;
    fStack_c4 = local_98._20_4_ + fStack_c4;
    fStack_c0 = local_98._24_4_ + fStack_c0;
    fStack_bc = local_98._28_4_ + auVar18._28_4_;
    local_f8 = local_f8 + auVar153._0_4_;
    fStack_f4 = fStack_f4 + auVar153._4_4_;
    fStack_f0 = fStack_f0 + auVar153._8_4_;
    fStack_ec = fStack_ec + auVar153._12_4_;
    fStack_e8 = fStack_e8 + auVar153._16_4_;
    fStack_e4 = fStack_e4 + auVar153._20_4_;
    fStack_e0 = fStack_e0 + auVar153._24_4_;
    fStack_dc = fVar283 + auVar153._28_4_;
    auVar18._4_4_ = fVar190 * fStack_f4;
    auVar18._0_4_ = fVar144 * local_f8;
    auVar18._8_4_ = fVar154 * fStack_f0;
    auVar18._12_4_ = fVar191 * fStack_ec;
    auVar18._16_4_ = fVar155 * fStack_e8;
    auVar18._20_4_ = fVar192 * fStack_e4;
    auVar18._24_4_ = fVar156 * fStack_e0;
    auVar18._28_4_ = fVar283;
    auVar26._4_4_ = fVar207 * fStack_d4;
    auVar26._0_4_ = fVar193 * local_d8;
    auVar26._8_4_ = fVar208 * fStack_d0;
    auVar26._12_4_ = fVar209 * fStack_cc;
    auVar26._16_4_ = fVar257 * fStack_c8;
    auVar26._20_4_ = fVar268 * fStack_c4;
    auVar26._24_4_ = fVar269 * fStack_c0;
    auVar26._28_4_ = fVar283 + auVar153._28_4_;
    auVar18 = vsubps_avx(auVar18,auVar26);
    local_4c8 = auVar20._0_4_;
    fStack_4c4 = auVar20._4_4_;
    fStack_4c0 = auVar20._8_4_;
    fStack_4bc = auVar20._12_4_;
    fStack_4b8 = auVar20._16_4_;
    fStack_4b4 = auVar20._20_4_;
    fStack_4b0 = auVar20._24_4_;
    auVar27._4_4_ = fVar190 * fStack_4c4;
    auVar27._0_4_ = fVar144 * local_4c8;
    auVar27._8_4_ = fVar154 * fStack_4c0;
    auVar27._12_4_ = fVar191 * fStack_4bc;
    auVar27._16_4_ = fVar155 * fStack_4b8;
    auVar27._20_4_ = fVar192 * fStack_4b4;
    auVar27._24_4_ = fVar156 * fStack_4b0;
    auVar27._28_4_ = fVar283;
    local_478._0_4_ = auVar86._0_4_;
    local_478._4_4_ = auVar86._4_4_;
    fStack_470 = auVar86._8_4_;
    fStack_46c = auVar86._12_4_;
    fStack_468 = auVar86._16_4_;
    fStack_464 = auVar86._20_4_;
    fStack_460 = auVar86._24_4_;
    auVar28._4_4_ = fVar207 * (float)local_478._4_4_;
    auVar28._0_4_ = fVar193 * (float)local_478._0_4_;
    auVar28._8_4_ = fVar208 * fStack_470;
    auVar28._12_4_ = fVar209 * fStack_46c;
    auVar28._16_4_ = fVar257 * fStack_468;
    auVar28._20_4_ = fVar268 * fStack_464;
    auVar28._24_4_ = fVar269 * fStack_460;
    auVar28._28_4_ = local_98._28_4_;
    auVar25 = vsubps_avx(auVar27,auVar28);
    auVar29._4_4_ = local_b8._4_4_ * fVar190;
    auVar29._0_4_ = local_b8._0_4_ * fVar144;
    auVar29._8_4_ = local_b8._8_4_ * fVar154;
    auVar29._12_4_ = local_b8._12_4_ * fVar191;
    auVar29._16_4_ = local_b8._16_4_ * fVar155;
    auVar29._20_4_ = local_b8._20_4_ * fVar192;
    auVar29._24_4_ = local_b8._24_4_ * fVar156;
    auVar29._28_4_ = fVar283;
    auVar30._4_4_ = local_3c8._4_4_ * fVar207;
    auVar30._0_4_ = local_3c8._0_4_ * fVar193;
    auVar30._8_4_ = local_3c8._8_4_ * fVar208;
    auVar30._12_4_ = local_3c8._12_4_ * fVar209;
    auVar30._16_4_ = local_3c8._16_4_ * fVar257;
    auVar30._20_4_ = local_3c8._20_4_ * fVar268;
    auVar30._24_4_ = local_3c8._24_4_ * fVar269;
    auVar30._28_4_ = local_b8._28_4_;
    local_4e8 = auVar19._0_4_;
    fStack_4e4 = auVar19._4_4_;
    fStack_4e0 = auVar19._8_4_;
    fStack_4dc = auVar19._12_4_;
    fStack_4d8 = auVar19._16_4_;
    fStack_4d4 = auVar19._20_4_;
    fStack_4d0 = auVar19._24_4_;
    auVar26 = vsubps_avx(auVar29,auVar30);
    auVar31._4_4_ = auVar240._4_4_ * fVar190;
    auVar31._0_4_ = auVar240._0_4_ * fVar144;
    auVar31._8_4_ = auVar240._8_4_ * fVar154;
    auVar31._12_4_ = auVar240._12_4_ * fVar191;
    auVar31._16_4_ = auVar240._16_4_ * fVar155;
    auVar31._20_4_ = auVar240._20_4_ * fVar192;
    auVar31._24_4_ = auVar240._24_4_ * fVar156;
    auVar31._28_4_ = fVar283;
    auVar32._4_4_ = fVar207 * auVar221._4_4_;
    auVar32._0_4_ = fVar193 * auVar221._0_4_;
    auVar32._8_4_ = fVar208 * auVar221._8_4_;
    auVar32._12_4_ = fVar209 * auVar221._12_4_;
    auVar32._16_4_ = fVar257 * auVar221._16_4_;
    auVar32._20_4_ = fVar268 * auVar221._20_4_;
    auVar32._24_4_ = fVar269 * auVar221._24_4_;
    auVar32._28_4_ = fStack_bc;
    auVar27 = vsubps_avx(auVar31,auVar32);
    local_118 = auVar221._0_4_ + local_118;
    fStack_114 = auVar221._4_4_ + fStack_114;
    fStack_110 = auVar221._8_4_ + fStack_110;
    fStack_10c = auVar221._12_4_ + fStack_10c;
    fStack_108 = auVar221._16_4_ + fStack_108;
    fStack_104 = auVar221._20_4_ + fStack_104;
    fStack_100 = auVar221._24_4_ + fStack_100;
    fStack_fc = auVar221._28_4_ + auVar21._28_4_;
    local_138 = auVar240._0_4_ + local_138;
    fStack_134 = auVar240._4_4_ + fStack_134;
    fStack_130 = auVar240._8_4_ + fStack_130;
    fStack_12c = auVar240._12_4_ + fStack_12c;
    fStack_128 = auVar240._16_4_ + fStack_128;
    fStack_124 = auVar240._20_4_ + fStack_124;
    fStack_120 = auVar240._24_4_ + fStack_120;
    fStack_11c = auVar240._28_4_ + auVar189._28_4_;
    auVar21._4_4_ = fVar190 * fStack_134;
    auVar21._0_4_ = fVar144 * local_138;
    auVar21._8_4_ = fVar154 * fStack_130;
    auVar21._12_4_ = fVar191 * fStack_12c;
    auVar21._16_4_ = fVar155 * fStack_128;
    auVar21._20_4_ = fVar192 * fStack_124;
    auVar21._24_4_ = fVar156 * fStack_120;
    auVar21._28_4_ = auVar240._28_4_ + auVar189._28_4_;
    auVar33._4_4_ = fStack_114 * fVar207;
    auVar33._0_4_ = local_118 * fVar193;
    auVar33._8_4_ = fStack_110 * fVar208;
    auVar33._12_4_ = fStack_10c * fVar209;
    auVar33._16_4_ = fStack_108 * fVar257;
    auVar33._20_4_ = fStack_104 * fVar268;
    auVar33._24_4_ = fStack_100 * fVar269;
    auVar33._28_4_ = fStack_fc;
    auVar21 = vsubps_avx(auVar21,auVar33);
    auVar34._4_4_ = fVar190 * auVar22._4_4_;
    auVar34._0_4_ = fVar144 * auVar22._0_4_;
    auVar34._8_4_ = fVar154 * auVar22._8_4_;
    auVar34._12_4_ = fVar191 * auVar22._12_4_;
    auVar34._16_4_ = fVar155 * auVar22._16_4_;
    auVar34._20_4_ = fVar192 * auVar22._20_4_;
    auVar34._24_4_ = fVar156 * auVar22._24_4_;
    auVar34._28_4_ = fStack_fc;
    auVar35._4_4_ = fVar207 * fStack_4e4;
    auVar35._0_4_ = fVar193 * local_4e8;
    auVar35._8_4_ = fVar208 * fStack_4e0;
    auVar35._12_4_ = fVar209 * fStack_4dc;
    auVar35._16_4_ = fVar257 * fStack_4d8;
    auVar35._20_4_ = fVar268 * fStack_4d4;
    auVar35._24_4_ = fVar269 * fStack_4d0;
    auVar35._28_4_ = auVar22._28_4_;
    auVar28 = vsubps_avx(auVar34,auVar35);
    auVar36._4_4_ = fVar190 * local_78._4_4_;
    auVar36._0_4_ = fVar144 * local_78._0_4_;
    auVar36._8_4_ = fVar154 * local_78._8_4_;
    auVar36._12_4_ = fVar191 * local_78._12_4_;
    auVar36._16_4_ = fVar155 * local_78._16_4_;
    auVar36._20_4_ = fVar192 * local_78._20_4_;
    auVar36._24_4_ = fVar156 * local_78._24_4_;
    auVar36._28_4_ = auVar88._28_4_ + auVar23._28_4_;
    auVar23._4_4_ = auVar87._4_4_ * fVar207;
    auVar23._0_4_ = auVar87._0_4_ * fVar193;
    auVar23._8_4_ = auVar87._8_4_ * fVar208;
    auVar23._12_4_ = auVar87._12_4_ * fVar209;
    auVar23._16_4_ = auVar87._16_4_ * fVar257;
    auVar23._20_4_ = auVar87._20_4_ * fVar268;
    auVar23._24_4_ = auVar87._24_4_ * fVar269;
    auVar23._28_4_ = auVar89._28_4_ + auVar17._28_4_;
    auVar23 = vsubps_avx(auVar36,auVar23);
    auVar19 = vminps_avx(auVar24,auVar18);
    auVar86 = vmaxps_avx(auVar24,auVar18);
    auVar20 = vminps_avx(auVar25,auVar26);
    auVar20 = vminps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(auVar25,auVar26);
    auVar86 = vmaxps_avx(auVar86,auVar19);
    auVar17 = vminps_avx(auVar27,auVar21);
    auVar19 = vmaxps_avx(auVar27,auVar21);
    auVar18 = vminps_avx(auVar28,auVar23);
    auVar18 = vminps_avx(auVar17,auVar18);
    auVar18 = vminps_avx(auVar20,auVar18);
    auVar20 = vmaxps_avx(auVar28,auVar23);
    auVar19 = vmaxps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(auVar86,auVar19);
    auVar86 = vcmpps_avx(auVar18,local_228,2);
    auVar19 = vcmpps_avx(auVar19,local_248,5);
    auVar86 = vandps_avx(auVar19,auVar86);
    auVar19 = local_158 & auVar86;
    if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0x7f,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar19 >> 0xbf,0) != '\0') ||
        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar19[0x1f] < '\0')
    {
      auVar19 = vsubps_avx(_local_3c8,local_98);
      auVar20 = vsubps_avx(auVar87,auVar221);
      fVar190 = auVar19._0_4_ + auVar20._0_4_;
      fVar154 = auVar19._4_4_ + auVar20._4_4_;
      fVar191 = auVar19._8_4_ + auVar20._8_4_;
      fVar155 = auVar19._12_4_ + auVar20._12_4_;
      fVar192 = auVar19._16_4_ + auVar20._16_4_;
      fVar156 = auVar19._20_4_ + auVar20._20_4_;
      fVar193 = auVar19._24_4_ + auVar20._24_4_;
      auVar18 = vsubps_avx(local_b8,auVar153);
      auVar21 = vsubps_avx(local_78,auVar240);
      fVar207 = auVar18._0_4_ + auVar21._0_4_;
      fVar208 = auVar18._4_4_ + auVar21._4_4_;
      fVar209 = auVar18._8_4_ + auVar21._8_4_;
      fVar257 = auVar18._12_4_ + auVar21._12_4_;
      fVar268 = auVar18._16_4_ + auVar21._16_4_;
      fVar269 = auVar18._20_4_ + auVar21._20_4_;
      fVar270 = auVar18._24_4_ + auVar21._24_4_;
      fVar144 = auVar21._28_4_;
      auVar37._4_4_ = auVar153._4_4_ * fVar154;
      auVar37._0_4_ = auVar153._0_4_ * fVar190;
      auVar37._8_4_ = auVar153._8_4_ * fVar191;
      auVar37._12_4_ = auVar153._12_4_ * fVar155;
      auVar37._16_4_ = auVar153._16_4_ * fVar192;
      auVar37._20_4_ = auVar153._20_4_ * fVar156;
      auVar37._24_4_ = auVar153._24_4_ * fVar193;
      auVar37._28_4_ = auVar153._28_4_;
      auVar38._4_4_ = local_98._4_4_ * fVar208;
      auVar38._0_4_ = local_98._0_4_ * fVar207;
      auVar38._8_4_ = local_98._8_4_ * fVar209;
      auVar38._12_4_ = local_98._12_4_ * fVar257;
      auVar38._16_4_ = local_98._16_4_ * fVar268;
      auVar38._20_4_ = local_98._20_4_ * fVar269;
      auVar38._24_4_ = local_98._24_4_ * fVar270;
      auVar38._28_4_ = local_98._28_4_;
      auVar21 = vsubps_avx(auVar37,auVar38);
      auVar39._4_4_ = fVar154 * fStack_f4;
      auVar39._0_4_ = fVar190 * local_f8;
      auVar39._8_4_ = fVar191 * fStack_f0;
      auVar39._12_4_ = fVar155 * fStack_ec;
      auVar39._16_4_ = fVar192 * fStack_e8;
      auVar39._20_4_ = fVar156 * fStack_e4;
      auVar39._24_4_ = fVar193 * fStack_e0;
      auVar39._28_4_ = auVar153._28_4_;
      auVar40._4_4_ = fVar208 * fStack_d4;
      auVar40._0_4_ = fVar207 * local_d8;
      auVar40._8_4_ = fVar209 * fStack_d0;
      auVar40._12_4_ = fVar257 * fStack_cc;
      auVar40._16_4_ = fVar268 * fStack_c8;
      auVar40._20_4_ = fVar269 * fStack_c4;
      auVar40._24_4_ = fVar270 * fStack_c0;
      auVar40._28_4_ = fVar144;
      auVar23 = vsubps_avx(auVar39,auVar40);
      auVar41._4_4_ = fVar154 * fStack_4c4;
      auVar41._0_4_ = fVar190 * local_4c8;
      auVar41._8_4_ = fVar191 * fStack_4c0;
      auVar41._12_4_ = fVar155 * fStack_4bc;
      auVar41._16_4_ = fVar192 * fStack_4b8;
      auVar41._20_4_ = fVar156 * fStack_4b4;
      auVar41._24_4_ = fVar193 * fStack_4b0;
      auVar41._28_4_ = fVar144;
      auVar42._4_4_ = fVar208 * (float)local_478._4_4_;
      auVar42._0_4_ = fVar207 * (float)local_478._0_4_;
      auVar42._8_4_ = fVar209 * fStack_470;
      auVar42._12_4_ = fVar257 * fStack_46c;
      auVar42._16_4_ = fVar268 * fStack_468;
      auVar42._20_4_ = fVar269 * fStack_464;
      auVar42._24_4_ = fVar270 * fStack_460;
      auVar42._28_4_ = auVar17._28_4_;
      auVar88 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = local_b8._4_4_ * fVar154;
      auVar43._0_4_ = local_b8._0_4_ * fVar190;
      auVar43._8_4_ = local_b8._8_4_ * fVar191;
      auVar43._12_4_ = local_b8._12_4_ * fVar155;
      auVar43._16_4_ = local_b8._16_4_ * fVar192;
      auVar43._20_4_ = local_b8._20_4_ * fVar156;
      auVar43._24_4_ = local_b8._24_4_ * fVar193;
      auVar43._28_4_ = auVar17._28_4_;
      auVar44._4_4_ = local_3c8._4_4_ * fVar208;
      auVar44._0_4_ = local_3c8._0_4_ * fVar207;
      auVar44._8_4_ = local_3c8._8_4_ * fVar209;
      auVar44._12_4_ = local_3c8._12_4_ * fVar257;
      auVar44._16_4_ = local_3c8._16_4_ * fVar268;
      auVar44._20_4_ = local_3c8._20_4_ * fVar269;
      uVar6 = local_3c8._28_4_;
      auVar44._24_4_ = local_3c8._24_4_ * fVar270;
      auVar44._28_4_ = uVar6;
      auVar89 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = auVar240._4_4_ * fVar154;
      auVar45._0_4_ = auVar240._0_4_ * fVar190;
      auVar45._8_4_ = auVar240._8_4_ * fVar191;
      auVar45._12_4_ = auVar240._12_4_ * fVar155;
      auVar45._16_4_ = auVar240._16_4_ * fVar192;
      auVar45._20_4_ = auVar240._20_4_ * fVar156;
      auVar45._24_4_ = auVar240._24_4_ * fVar193;
      auVar45._28_4_ = uVar6;
      auVar46._4_4_ = auVar221._4_4_ * fVar208;
      auVar46._0_4_ = auVar221._0_4_ * fVar207;
      auVar46._8_4_ = auVar221._8_4_ * fVar209;
      auVar46._12_4_ = auVar221._12_4_ * fVar257;
      auVar46._16_4_ = auVar221._16_4_ * fVar268;
      auVar46._20_4_ = auVar221._20_4_ * fVar269;
      auVar46._24_4_ = auVar221._24_4_ * fVar270;
      auVar46._28_4_ = auVar221._28_4_;
      auVar24 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = fVar154 * fStack_134;
      auVar47._0_4_ = fVar190 * local_138;
      auVar47._8_4_ = fVar191 * fStack_130;
      auVar47._12_4_ = fVar155 * fStack_12c;
      auVar47._16_4_ = fVar192 * fStack_128;
      auVar47._20_4_ = fVar156 * fStack_124;
      auVar47._24_4_ = fVar193 * fStack_120;
      auVar47._28_4_ = uVar6;
      auVar48._4_4_ = fVar208 * fStack_114;
      auVar48._0_4_ = fVar207 * local_118;
      auVar48._8_4_ = fVar209 * fStack_110;
      auVar48._12_4_ = fVar257 * fStack_10c;
      auVar48._16_4_ = fVar268 * fStack_108;
      auVar48._20_4_ = fVar269 * fStack_104;
      auVar48._24_4_ = fVar270 * fStack_100;
      auVar48._28_4_ = auVar240._28_4_;
      auVar25 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = fVar154 * auVar22._4_4_;
      auVar49._0_4_ = fVar190 * auVar22._0_4_;
      auVar49._8_4_ = fVar191 * auVar22._8_4_;
      auVar49._12_4_ = fVar155 * auVar22._12_4_;
      auVar49._16_4_ = fVar192 * auVar22._16_4_;
      auVar49._20_4_ = fVar156 * auVar22._20_4_;
      auVar49._24_4_ = fVar193 * auVar22._24_4_;
      auVar49._28_4_ = auVar240._28_4_;
      auVar50._4_4_ = fStack_4e4 * fVar208;
      auVar50._0_4_ = local_4e8 * fVar207;
      auVar50._8_4_ = fStack_4e0 * fVar209;
      auVar50._12_4_ = fStack_4dc * fVar257;
      auVar50._16_4_ = fStack_4d8 * fVar268;
      auVar50._20_4_ = fStack_4d4 * fVar269;
      auVar50._24_4_ = fStack_4d0 * fVar270;
      auVar50._28_4_ = local_b8._28_4_;
      auVar22 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = local_78._4_4_ * fVar154;
      auVar51._0_4_ = local_78._0_4_ * fVar190;
      auVar51._8_4_ = local_78._8_4_ * fVar191;
      auVar51._12_4_ = local_78._12_4_ * fVar155;
      auVar51._16_4_ = local_78._16_4_ * fVar192;
      auVar51._20_4_ = local_78._20_4_ * fVar156;
      auVar51._24_4_ = local_78._24_4_ * fVar193;
      auVar51._28_4_ = auVar19._28_4_ + auVar20._28_4_;
      auVar52._4_4_ = auVar87._4_4_ * fVar208;
      auVar52._0_4_ = auVar87._0_4_ * fVar207;
      auVar52._8_4_ = auVar87._8_4_ * fVar209;
      auVar52._12_4_ = auVar87._12_4_ * fVar257;
      auVar52._16_4_ = auVar87._16_4_ * fVar268;
      auVar52._20_4_ = auVar87._20_4_ * fVar269;
      auVar52._24_4_ = auVar87._24_4_ * fVar270;
      auVar52._28_4_ = auVar18._28_4_ + fVar144;
      auVar26 = vsubps_avx(auVar51,auVar52);
      auVar20 = vminps_avx(auVar21,auVar23);
      auVar19 = vmaxps_avx(auVar21,auVar23);
      auVar17 = vminps_avx(auVar88,auVar89);
      auVar17 = vminps_avx(auVar20,auVar17);
      auVar20 = vmaxps_avx(auVar88,auVar89);
      auVar19 = vmaxps_avx(auVar19,auVar20);
      auVar18 = vminps_avx(auVar24,auVar25);
      auVar20 = vmaxps_avx(auVar24,auVar25);
      auVar87 = vminps_avx(auVar22,auVar26);
      auVar18 = vminps_avx(auVar18,auVar87);
      auVar18 = vminps_avx(auVar17,auVar18);
      auVar17 = vmaxps_avx(auVar22,auVar26);
      auVar20 = vmaxps_avx(auVar20,auVar17);
      auVar20 = vmaxps_avx(auVar19,auVar20);
      auVar19 = vcmpps_avx(auVar18,local_228,2);
      auVar20 = vcmpps_avx(auVar20,local_248,5);
      auVar19 = vandps_avx(auVar20,auVar19);
      auVar86 = vandps_avx(local_158,auVar86);
      auVar20 = auVar86 & auVar19;
      if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar20 >> 0x7f,0) != '\0') ||
            (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0xbf,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar20[0x1f] < '\0') {
        auVar86 = vandps_avx(auVar19,auVar86);
        uVar62 = vmovmskps_avx(auVar86);
        if (uVar62 != 0) {
          uVar59 = (ulong)uVar61;
          auStack_3a8[uVar59] = uVar62 & 0xff;
          uVar7 = vmovlps_avx(auVar145);
          *(undefined8 *)(afStack_208 + uVar59 * 2) = uVar7;
          uVar63 = vmovlps_avx(auVar121);
          auStack_58[uVar59] = uVar63;
          uVar61 = uVar61 + 1;
        }
      }
    }
    if (uVar61 != 0) {
      do {
        uVar59 = (ulong)(uVar61 - 1);
        uVar62 = auStack_3a8[uVar59];
        fVar144 = afStack_208[uVar59 * 2];
        fVar190 = afStack_208[uVar59 * 2 + 1];
        auVar261._8_8_ = 0;
        auVar261._0_8_ = auStack_58[uVar59];
        auVar267 = ZEXT1664(auVar261);
        uVar63 = 0;
        if (uVar62 != 0) {
          for (; (uVar62 >> uVar63 & 1) == 0; uVar63 = uVar63 + 1) {
          }
        }
        uVar62 = uVar62 - 1 & uVar62;
        auStack_3a8[uVar59] = uVar62;
        if (uVar62 == 0) {
          uVar61 = uVar61 - 1;
        }
        fVar191 = (float)(uVar63 + 1) * 0.14285715;
        fVar154 = (1.0 - (float)uVar63 * 0.14285715) * fVar144 +
                  fVar190 * (float)uVar63 * 0.14285715;
        fVar144 = (1.0 - fVar191) * fVar144 + fVar190 * fVar191;
        fVar190 = fVar144 - fVar154;
        if (0.16666667 <= fVar190) {
          auVar73 = vinsertps_avx(ZEXT416((uint)fVar154),ZEXT416((uint)fVar144),0x10);
          auVar275 = ZEXT1664(auVar73);
          goto LAB_00e0b505;
        }
        auVar73 = vshufps_avx(auVar261,auVar261,0x50);
        auVar97._8_4_ = 0x3f800000;
        auVar97._0_8_ = 0x3f8000003f800000;
        auVar97._12_4_ = 0x3f800000;
        auVar198 = vsubps_avx(auVar97,auVar73);
        fVar191 = auVar73._0_4_;
        fVar155 = auVar73._4_4_;
        fVar192 = auVar73._8_4_;
        fVar156 = auVar73._12_4_;
        fVar193 = auVar198._0_4_;
        fVar207 = auVar198._4_4_;
        fVar208 = auVar198._8_4_;
        fVar209 = auVar198._12_4_;
        auVar125._0_4_ = fVar191 * auVar286._0_4_ + fVar193 * fVar247;
        auVar125._4_4_ = fVar155 * auVar286._4_4_ + fVar207 * fVar255;
        auVar125._8_4_ = fVar192 * auVar286._0_4_ + fVar208 * fVar247;
        auVar125._12_4_ = fVar156 * auVar286._4_4_ + fVar209 * fVar255;
        auVar162._0_4_ = fVar191 * auVar249._0_4_ + fVar193 * fVar254;
        auVar162._4_4_ = fVar155 * auVar249._4_4_ + fVar207 * fVar256;
        auVar162._8_4_ = fVar192 * auVar249._0_4_ + fVar208 * fVar254;
        auVar162._12_4_ = fVar156 * auVar249._4_4_ + fVar209 * fVar256;
        auVar182._0_4_ = fVar191 * auVar96._0_4_ + auVar302._0_4_ * fVar193;
        auVar182._4_4_ = fVar155 * auVar96._4_4_ + auVar302._4_4_ * fVar207;
        auVar182._8_4_ = fVar192 * auVar96._0_4_ + auVar302._0_4_ * fVar208;
        auVar182._12_4_ = fVar156 * auVar96._4_4_ + auVar302._4_4_ * fVar209;
        auVar70._0_4_ = auVar68._0_4_ * fVar191 + auVar293._0_4_ * fVar193;
        auVar70._4_4_ = auVar68._4_4_ * fVar155 + auVar293._4_4_ * fVar207;
        auVar70._8_4_ = auVar68._0_4_ * fVar192 + auVar293._0_4_ * fVar208;
        auVar70._12_4_ = auVar68._4_4_ * fVar156 + auVar293._4_4_ * fVar209;
        auVar115._16_16_ = auVar125;
        auVar115._0_16_ = auVar125;
        auVar142._16_16_ = auVar162;
        auVar142._0_16_ = auVar162;
        auVar173._16_16_ = auVar182;
        auVar173._0_16_ = auVar182;
        _local_478 = ZEXT432((uint)fVar154);
        auVar86 = ZEXT2032(CONCAT416(fVar144,ZEXT416((uint)fVar154)));
        auVar86 = vshufps_avx(auVar86,auVar86,0);
        auVar19 = vsubps_avx(auVar142,auVar115);
        fVar191 = auVar86._0_4_;
        fVar155 = auVar86._4_4_;
        fVar192 = auVar86._8_4_;
        fVar156 = auVar86._12_4_;
        fVar193 = auVar86._16_4_;
        fVar207 = auVar86._20_4_;
        fVar208 = auVar86._24_4_;
        auVar116._0_4_ = auVar125._0_4_ + auVar19._0_4_ * fVar191;
        auVar116._4_4_ = auVar125._4_4_ + auVar19._4_4_ * fVar155;
        auVar116._8_4_ = auVar125._8_4_ + auVar19._8_4_ * fVar192;
        auVar116._12_4_ = auVar125._12_4_ + auVar19._12_4_ * fVar156;
        auVar116._16_4_ = auVar125._0_4_ + auVar19._16_4_ * fVar193;
        auVar116._20_4_ = auVar125._4_4_ + auVar19._20_4_ * fVar207;
        auVar116._24_4_ = auVar125._8_4_ + auVar19._24_4_ * fVar208;
        auVar116._28_4_ = auVar125._12_4_ + auVar19._28_4_;
        auVar86 = vsubps_avx(auVar173,auVar142);
        auVar143._0_4_ = auVar162._0_4_ + auVar86._0_4_ * fVar191;
        auVar143._4_4_ = auVar162._4_4_ + auVar86._4_4_ * fVar155;
        auVar143._8_4_ = auVar162._8_4_ + auVar86._8_4_ * fVar192;
        auVar143._12_4_ = auVar162._12_4_ + auVar86._12_4_ * fVar156;
        auVar143._16_4_ = auVar162._0_4_ + auVar86._16_4_ * fVar193;
        auVar143._20_4_ = auVar162._4_4_ + auVar86._20_4_ * fVar207;
        auVar143._24_4_ = auVar162._8_4_ + auVar86._24_4_ * fVar208;
        auVar143._28_4_ = auVar162._12_4_ + auVar86._28_4_;
        auVar73 = vsubps_avx(auVar70,auVar182);
        auVar90._0_4_ = auVar182._0_4_ + auVar73._0_4_ * fVar191;
        auVar90._4_4_ = auVar182._4_4_ + auVar73._4_4_ * fVar155;
        auVar90._8_4_ = auVar182._8_4_ + auVar73._8_4_ * fVar192;
        auVar90._12_4_ = auVar182._12_4_ + auVar73._12_4_ * fVar156;
        auVar90._16_4_ = auVar182._0_4_ + auVar73._0_4_ * fVar193;
        auVar90._20_4_ = auVar182._4_4_ + auVar73._4_4_ * fVar207;
        auVar90._24_4_ = auVar182._8_4_ + auVar73._8_4_ * fVar208;
        auVar90._28_4_ = auVar182._12_4_ + auVar73._12_4_;
        auVar86 = vsubps_avx(auVar143,auVar116);
        auVar117._0_4_ = auVar116._0_4_ + fVar191 * auVar86._0_4_;
        auVar117._4_4_ = auVar116._4_4_ + fVar155 * auVar86._4_4_;
        auVar117._8_4_ = auVar116._8_4_ + fVar192 * auVar86._8_4_;
        auVar117._12_4_ = auVar116._12_4_ + fVar156 * auVar86._12_4_;
        auVar117._16_4_ = auVar116._16_4_ + fVar193 * auVar86._16_4_;
        auVar117._20_4_ = auVar116._20_4_ + fVar207 * auVar86._20_4_;
        auVar117._24_4_ = auVar116._24_4_ + fVar208 * auVar86._24_4_;
        auVar117._28_4_ = auVar116._28_4_ + auVar86._28_4_;
        auVar86 = vsubps_avx(auVar90,auVar143);
        auVar91._0_4_ = auVar143._0_4_ + fVar191 * auVar86._0_4_;
        auVar91._4_4_ = auVar143._4_4_ + fVar155 * auVar86._4_4_;
        auVar91._8_4_ = auVar143._8_4_ + fVar192 * auVar86._8_4_;
        auVar91._12_4_ = auVar143._12_4_ + fVar156 * auVar86._12_4_;
        auVar91._16_4_ = auVar143._16_4_ + fVar193 * auVar86._16_4_;
        auVar91._20_4_ = auVar143._20_4_ + fVar207 * auVar86._20_4_;
        auVar91._24_4_ = auVar143._24_4_ + fVar208 * auVar86._24_4_;
        auVar91._28_4_ = auVar143._28_4_ + auVar86._28_4_;
        auVar86 = vsubps_avx(auVar91,auVar117);
        auVar201._0_4_ = auVar117._0_4_ + fVar191 * auVar86._0_4_;
        auVar201._4_4_ = auVar117._4_4_ + fVar155 * auVar86._4_4_;
        auVar201._8_4_ = auVar117._8_4_ + fVar192 * auVar86._8_4_;
        auVar201._12_4_ = auVar117._12_4_ + fVar156 * auVar86._12_4_;
        auVar206._16_4_ = auVar117._16_4_ + fVar193 * auVar86._16_4_;
        auVar206._0_16_ = auVar201;
        auVar206._20_4_ = auVar117._20_4_ + fVar207 * auVar86._20_4_;
        auVar206._24_4_ = auVar117._24_4_ + fVar208 * auVar86._24_4_;
        auVar206._28_4_ = auVar117._28_4_ + auVar143._28_4_;
        auVar119 = auVar206._16_16_;
        auVar99 = vshufps_avx(ZEXT416((uint)(fVar190 * 0.33333334)),
                              ZEXT416((uint)(fVar190 * 0.33333334)),0);
        auVar163._0_4_ = auVar201._0_4_ + auVar99._0_4_ * auVar86._0_4_ * 3.0;
        auVar163._4_4_ = auVar201._4_4_ + auVar99._4_4_ * auVar86._4_4_ * 3.0;
        auVar163._8_4_ = auVar201._8_4_ + auVar99._8_4_ * auVar86._8_4_ * 3.0;
        auVar163._12_4_ = auVar201._12_4_ + auVar99._12_4_ * auVar86._12_4_ * 3.0;
        auVar141 = vshufpd_avx(auVar201,auVar201,3);
        auVar67 = vshufpd_avx(auVar119,auVar119,3);
        _local_3c8 = auVar141;
        auVar73 = vsubps_avx(auVar141,auVar201);
        auVar198 = vsubps_avx(auVar67,auVar119);
        auVar71._0_4_ = auVar73._0_4_ + auVar198._0_4_;
        auVar71._4_4_ = auVar73._4_4_ + auVar198._4_4_;
        auVar71._8_4_ = auVar73._8_4_ + auVar198._8_4_;
        auVar71._12_4_ = auVar73._12_4_ + auVar198._12_4_;
        auVar73 = vmovshdup_avx(auVar201);
        auVar198 = vmovshdup_avx(auVar163);
        auVar127 = vshufps_avx(auVar71,auVar71,0);
        auVar100 = vshufps_avx(auVar71,auVar71,0x55);
        fVar191 = auVar100._0_4_;
        fVar155 = auVar100._4_4_;
        fVar192 = auVar100._8_4_;
        fVar156 = auVar100._12_4_;
        fVar193 = auVar127._0_4_;
        fVar207 = auVar127._4_4_;
        fVar208 = auVar127._8_4_;
        fVar209 = auVar127._12_4_;
        auVar72._0_4_ = fVar193 * auVar201._0_4_ + auVar73._0_4_ * fVar191;
        auVar72._4_4_ = fVar207 * auVar201._4_4_ + auVar73._4_4_ * fVar155;
        auVar72._8_4_ = fVar208 * auVar201._8_4_ + auVar73._8_4_ * fVar192;
        auVar72._12_4_ = fVar209 * auVar201._12_4_ + auVar73._12_4_ * fVar156;
        auVar262._0_4_ = fVar193 * auVar163._0_4_ + auVar198._0_4_ * fVar191;
        auVar262._4_4_ = fVar207 * auVar163._4_4_ + auVar198._4_4_ * fVar155;
        auVar262._8_4_ = fVar208 * auVar163._8_4_ + auVar198._8_4_ * fVar192;
        auVar262._12_4_ = fVar209 * auVar163._12_4_ + auVar198._12_4_ * fVar156;
        auVar198 = vshufps_avx(auVar72,auVar72,0xe8);
        auVar127 = vshufps_avx(auVar262,auVar262,0xe8);
        auVar73 = vcmpps_avx(auVar198,auVar127,1);
        uVar62 = vextractps_avx(auVar73,0);
        auVar100 = auVar262;
        if ((uVar62 & 1) == 0) {
          auVar100 = auVar72;
        }
        auVar98._0_4_ = auVar99._0_4_ * auVar86._16_4_ * 3.0;
        auVar98._4_4_ = auVar99._4_4_ * auVar86._20_4_ * 3.0;
        auVar98._8_4_ = auVar99._8_4_ * auVar86._24_4_ * 3.0;
        auVar98._12_4_ = auVar99._12_4_ * 0.0;
        auVar120 = vsubps_avx(auVar119,auVar98);
        auVar99 = vmovshdup_avx(auVar120);
        auVar119 = vmovshdup_avx(auVar119);
        fVar257 = auVar120._0_4_;
        fVar268 = auVar120._4_4_;
        auVar183._0_4_ = fVar257 * fVar193 + auVar99._0_4_ * fVar191;
        auVar183._4_4_ = fVar268 * fVar207 + auVar99._4_4_ * fVar155;
        auVar183._8_4_ = auVar120._8_4_ * fVar208 + auVar99._8_4_ * fVar192;
        auVar183._12_4_ = auVar120._12_4_ * fVar209 + auVar99._12_4_ * fVar156;
        auVar303._0_4_ = fVar193 * auVar206._16_4_ + auVar119._0_4_ * fVar191;
        auVar303._4_4_ = fVar207 * auVar206._20_4_ + auVar119._4_4_ * fVar155;
        auVar303._8_4_ = fVar208 * auVar206._24_4_ + auVar119._8_4_ * fVar192;
        auVar303._12_4_ = fVar209 * auVar206._28_4_ + auVar119._12_4_ * fVar156;
        auVar119 = vshufps_avx(auVar183,auVar183,0xe8);
        auVar118 = vshufps_avx(auVar303,auVar303,0xe8);
        auVar99 = vcmpps_avx(auVar119,auVar118,1);
        uVar62 = vextractps_avx(auVar99,0);
        auVar121 = auVar303;
        if ((uVar62 & 1) == 0) {
          auVar121 = auVar183;
        }
        auVar100 = vmaxss_avx(auVar121,auVar100);
        auVar198 = vminps_avx(auVar198,auVar127);
        auVar127 = vminps_avx(auVar119,auVar118);
        auVar127 = vminps_avx(auVar198,auVar127);
        auVar73 = vshufps_avx(auVar73,auVar73,0x55);
        auVar73 = vblendps_avx(auVar73,auVar99,2);
        auVar99 = vpslld_avx(auVar73,0x1f);
        auVar73 = vshufpd_avx(auVar262,auVar262,1);
        auVar73 = vinsertps_avx(auVar73,auVar303,0x9c);
        auVar198 = vshufpd_avx(auVar72,auVar72,1);
        auVar198 = vinsertps_avx(auVar198,auVar183,0x9c);
        auVar73 = vblendvps_avx(auVar198,auVar73,auVar99);
        auVar198 = vmovshdup_avx(auVar73);
        auVar73 = vmaxss_avx(auVar198,auVar73);
        fVar192 = auVar127._0_4_;
        auVar198 = vmovshdup_avx(auVar127);
        fVar155 = auVar73._0_4_;
        fVar156 = auVar198._0_4_;
        fVar191 = auVar100._0_4_;
        if ((0.0001 <= fVar192) || (fVar155 <= -0.0001)) {
          if ((fVar156 < 0.0001 && -0.0001 < fVar191) || (fVar192 < 0.0001 && -0.0001 < fVar191))
          goto LAB_00e0bf07;
          auVar99 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar73,1);
          auVar198 = vcmpps_avx(auVar198,SUB6416(ZEXT464(0x38d1b717),0),1);
          auVar198 = vandps_avx(auVar198,auVar99);
          if ((auVar198 & (undefined1  [16])0x1) != (undefined1  [16])0x0) goto LAB_00e0bf07;
        }
        else {
LAB_00e0bf07:
          auVar99 = vcmpps_avx(auVar127,_DAT_01f7aa10,1);
          auVar198 = vcmpss_avx(auVar100,ZEXT416(0) << 0x20,1);
          auVar126._8_4_ = 0x3f800000;
          auVar126._0_8_ = 0x3f8000003f800000;
          auVar126._12_4_ = 0x3f800000;
          auVar164._8_4_ = 0xbf800000;
          auVar164._0_8_ = 0xbf800000bf800000;
          auVar164._12_4_ = 0xbf800000;
          auVar198 = vblendvps_avx(auVar126,auVar164,auVar198);
          auVar99 = vblendvps_avx(auVar126,auVar164,auVar99);
          auVar127 = vcmpss_avx(auVar99,auVar198,4);
          auVar127 = vpshufd_avx(ZEXT416(auVar127._0_4_ & 1),0x50);
          auVar127 = vpslld_avx(auVar127,0x1f);
          auVar127 = vpsrad_avx(auVar127,0x1f);
          auVar127 = vpandn_avx(auVar127,_DAT_01fafeb0);
          auVar100 = vmovshdup_avx(auVar99);
          fVar193 = auVar100._0_4_;
          if ((auVar99._0_4_ != fVar193) || (NAN(auVar99._0_4_) || NAN(fVar193))) {
            if ((fVar156 != fVar192) || (NAN(fVar156) || NAN(fVar192))) {
              fVar192 = -fVar192 / (fVar156 - fVar192);
              auVar99 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar192) * 0.0 + fVar192)));
            }
            else {
              auVar99 = ZEXT816(0x3f80000000000000);
              if ((fVar192 != 0.0) || (NAN(fVar192))) {
                auVar99 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar119 = vcmpps_avx(auVar127,auVar99,1);
            auVar100 = vblendps_avx(auVar127,auVar99,2);
            auVar99 = vblendps_avx(auVar99,auVar127,2);
            auVar127 = vblendvps_avx(auVar99,auVar100,auVar119);
          }
          auVar73 = vcmpss_avx(auVar73,ZEXT416(0) << 0x20,1);
          auVar128._8_4_ = 0x3f800000;
          auVar128._0_8_ = 0x3f8000003f800000;
          auVar128._12_4_ = 0x3f800000;
          auVar165._8_4_ = 0xbf800000;
          auVar165._0_8_ = 0xbf800000bf800000;
          auVar165._12_4_ = 0xbf800000;
          auVar73 = vblendvps_avx(auVar128,auVar165,auVar73);
          fVar192 = auVar73._0_4_;
          if ((auVar198._0_4_ != fVar192) || (NAN(auVar198._0_4_) || NAN(fVar192))) {
            if ((fVar155 != fVar191) || (NAN(fVar155) || NAN(fVar191))) {
              fVar191 = -fVar191 / (fVar155 - fVar191);
              auVar73 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar191) * 0.0 + fVar191)));
            }
            else {
              auVar73 = ZEXT816(0x3f80000000000000);
              if ((fVar191 != 0.0) || (NAN(fVar191))) {
                auVar73 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar99 = vcmpps_avx(auVar127,auVar73,1);
            auVar198 = vblendps_avx(auVar127,auVar73,2);
            auVar73 = vblendps_avx(auVar73,auVar127,2);
            auVar127 = vblendvps_avx(auVar73,auVar198,auVar99);
          }
          if ((fVar193 != fVar192) || (NAN(fVar193) || NAN(fVar192))) {
            auVar74._8_4_ = 0x3f800000;
            auVar74._0_8_ = 0x3f8000003f800000;
            auVar74._12_4_ = 0x3f800000;
            auVar73 = vcmpps_avx(auVar127,auVar74,1);
            auVar198 = vinsertps_avx(auVar127,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar129._4_12_ = auVar127._4_12_;
            auVar129._0_4_ = 0x3f800000;
            auVar127 = vblendvps_avx(auVar129,auVar198,auVar73);
          }
          auVar73 = vcmpps_avx(auVar127,_DAT_01f7b6f0,1);
          auVar54._12_4_ = 0;
          auVar54._0_12_ = auVar127._4_12_;
          auVar198 = vinsertps_avx(auVar127,ZEXT416(0x3f800000),0x10);
          auVar73 = vblendvps_avx(auVar198,auVar54 << 0x20,auVar73);
          auVar198 = vmovshdup_avx(auVar73);
          if (auVar73._0_4_ <= auVar198._0_4_) {
            auVar75._0_4_ = auVar73._0_4_ + -0.1;
            auVar75._4_4_ = auVar73._4_4_ + 0.1;
            auVar75._8_4_ = auVar73._8_4_ + 0.0;
            auVar75._12_4_ = auVar73._12_4_ + 0.0;
            auVar99 = vshufpd_avx(auVar163,auVar163,3);
            auVar202._8_8_ = 0x3f80000000000000;
            auVar202._0_8_ = 0x3f80000000000000;
            auVar73 = vcmpps_avx(auVar75,auVar202,1);
            auVar53._12_4_ = 0;
            auVar53._0_12_ = auVar75._4_12_;
            auVar198 = vinsertps_avx(auVar75,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar73 = vblendvps_avx(auVar198,auVar53 << 0x20,auVar73);
            auVar198 = vshufpd_avx(auVar120,auVar120,3);
            auVar127 = vshufps_avx(auVar73,auVar73,0x50);
            auVar203._8_4_ = 0x3f800000;
            auVar203._0_8_ = 0x3f8000003f800000;
            auVar203._12_4_ = 0x3f800000;
            auVar100 = vsubps_avx(auVar203,auVar127);
            local_3c8._0_4_ = auVar141._0_4_;
            local_3c8._4_4_ = auVar141._4_4_;
            fStack_3c0 = auVar141._8_4_;
            fStack_3bc = auVar141._12_4_;
            fVar191 = auVar127._0_4_;
            fVar155 = auVar127._4_4_;
            fVar192 = auVar127._8_4_;
            fVar156 = auVar127._12_4_;
            local_578 = auVar67._0_4_;
            fStack_574 = auVar67._4_4_;
            fStack_570 = auVar67._8_4_;
            fStack_56c = auVar67._12_4_;
            fVar193 = auVar100._0_4_;
            fVar207 = auVar100._4_4_;
            fVar208 = auVar100._8_4_;
            fVar209 = auVar100._12_4_;
            auVar76._0_4_ = fVar191 * (float)local_3c8._0_4_ + fVar193 * auVar201._0_4_;
            auVar76._4_4_ = fVar155 * (float)local_3c8._4_4_ + fVar207 * auVar201._4_4_;
            auVar76._8_4_ = fVar192 * fStack_3c0 + fVar208 * auVar201._0_4_;
            auVar76._12_4_ = fVar156 * fStack_3bc + fVar209 * auVar201._4_4_;
            auVar184._0_4_ = auVar99._0_4_ * fVar191 + fVar193 * auVar163._0_4_;
            auVar184._4_4_ = auVar99._4_4_ * fVar155 + fVar207 * auVar163._4_4_;
            auVar184._8_4_ = auVar99._8_4_ * fVar192 + fVar208 * auVar163._0_4_;
            auVar184._12_4_ = auVar99._12_4_ * fVar156 + fVar209 * auVar163._4_4_;
            auVar219._0_4_ = auVar198._0_4_ * fVar191 + fVar193 * fVar257;
            auVar219._4_4_ = auVar198._4_4_ * fVar155 + fVar207 * fVar268;
            auVar219._8_4_ = auVar198._8_4_ * fVar192 + fVar208 * fVar257;
            auVar219._12_4_ = auVar198._12_4_ * fVar156 + fVar209 * fVar268;
            auVar250._0_4_ = fVar191 * local_578 + fVar193 * auVar206._16_4_;
            auVar250._4_4_ = fVar155 * fStack_574 + fVar207 * auVar206._20_4_;
            auVar250._8_4_ = fVar192 * fStack_570 + fVar208 * auVar206._16_4_;
            auVar250._12_4_ = fVar156 * fStack_56c + fVar209 * auVar206._20_4_;
            auVar67 = vsubps_avx(auVar203,auVar73);
            auVar198 = vmovshdup_avx(auVar261);
            auVar141 = vmovsldup_avx(auVar261);
            auVar204._0_4_ = auVar67._0_4_ * auVar141._0_4_ + auVar73._0_4_ * auVar198._0_4_;
            auVar204._4_4_ = auVar67._4_4_ * auVar141._4_4_ + auVar73._4_4_ * auVar198._4_4_;
            auVar204._8_4_ = auVar67._8_4_ * auVar141._8_4_ + auVar73._8_4_ * auVar198._8_4_;
            auVar204._12_4_ = auVar67._12_4_ * auVar141._12_4_ + auVar73._12_4_ * auVar198._12_4_;
            auVar120 = vmovshdup_avx(auVar204);
            auVar73 = vsubps_avx(auVar184,auVar76);
            auVar130._0_4_ = auVar73._0_4_ * 3.0;
            auVar130._4_4_ = auVar73._4_4_ * 3.0;
            auVar130._8_4_ = auVar73._8_4_ * 3.0;
            auVar130._12_4_ = auVar73._12_4_ * 3.0;
            auVar73 = vsubps_avx(auVar219,auVar184);
            auVar150._0_4_ = auVar73._0_4_ * 3.0;
            auVar150._4_4_ = auVar73._4_4_ * 3.0;
            auVar150._8_4_ = auVar73._8_4_ * 3.0;
            auVar150._12_4_ = auVar73._12_4_ * 3.0;
            auVar73 = vsubps_avx(auVar250,auVar219);
            auVar226._0_4_ = auVar73._0_4_ * 3.0;
            auVar226._4_4_ = auVar73._4_4_ * 3.0;
            auVar226._8_4_ = auVar73._8_4_ * 3.0;
            auVar226._12_4_ = auVar73._12_4_ * 3.0;
            auVar198 = vminps_avx(auVar150,auVar226);
            auVar73 = vmaxps_avx(auVar150,auVar226);
            auVar198 = vminps_avx(auVar130,auVar198);
            auVar73 = vmaxps_avx(auVar130,auVar73);
            auVar141 = vshufpd_avx(auVar198,auVar198,3);
            auVar67 = vshufpd_avx(auVar73,auVar73,3);
            auVar198 = vminps_avx(auVar198,auVar141);
            auVar73 = vmaxps_avx(auVar73,auVar67);
            auVar141 = vshufps_avx(ZEXT416((uint)(1.0 / fVar190)),ZEXT416((uint)(1.0 / fVar190)),0);
            auVar227._0_4_ = auVar141._0_4_ * auVar198._0_4_;
            auVar227._4_4_ = auVar141._4_4_ * auVar198._4_4_;
            auVar227._8_4_ = auVar141._8_4_ * auVar198._8_4_;
            auVar227._12_4_ = auVar141._12_4_ * auVar198._12_4_;
            auVar236._0_4_ = auVar141._0_4_ * auVar73._0_4_;
            auVar236._4_4_ = auVar141._4_4_ * auVar73._4_4_;
            auVar236._8_4_ = auVar141._8_4_ * auVar73._8_4_;
            auVar236._12_4_ = auVar141._12_4_ * auVar73._12_4_;
            auVar100 = ZEXT416((uint)(1.0 / (auVar120._0_4_ - auVar204._0_4_)));
            auVar73 = vshufpd_avx(auVar76,auVar76,3);
            auVar198 = vshufpd_avx(auVar184,auVar184,3);
            auVar141 = vshufpd_avx(auVar219,auVar219,3);
            auVar67 = vshufpd_avx(auVar250,auVar250,3);
            auVar73 = vsubps_avx(auVar73,auVar76);
            auVar99 = vsubps_avx(auVar198,auVar184);
            auVar127 = vsubps_avx(auVar141,auVar219);
            auVar67 = vsubps_avx(auVar67,auVar250);
            auVar198 = vminps_avx(auVar73,auVar99);
            auVar73 = vmaxps_avx(auVar73,auVar99);
            auVar141 = vminps_avx(auVar127,auVar67);
            auVar141 = vminps_avx(auVar198,auVar141);
            auVar198 = vmaxps_avx(auVar127,auVar67);
            auVar73 = vmaxps_avx(auVar73,auVar198);
            auVar198 = vshufps_avx(auVar100,auVar100,0);
            auVar287._0_4_ = auVar198._0_4_ * auVar141._0_4_;
            auVar287._4_4_ = auVar198._4_4_ * auVar141._4_4_;
            auVar287._8_4_ = auVar198._8_4_ * auVar141._8_4_;
            auVar287._12_4_ = auVar198._12_4_ * auVar141._12_4_;
            auVar295._0_4_ = auVar198._0_4_ * auVar73._0_4_;
            auVar295._4_4_ = auVar198._4_4_ * auVar73._4_4_;
            auVar295._8_4_ = auVar198._8_4_ * auVar73._8_4_;
            auVar295._12_4_ = auVar198._12_4_ * auVar73._12_4_;
            auVar73 = vmovsldup_avx(auVar204);
            auVar251._4_12_ = auVar73._4_12_;
            auVar251._0_4_ = fVar154;
            auVar263._4_12_ = auVar204._4_12_;
            auVar263._0_4_ = fVar144;
            auVar151._0_4_ = (fVar154 + fVar144) * 0.5;
            auVar151._4_4_ = (auVar73._4_4_ + auVar204._4_4_) * 0.5;
            auVar151._8_4_ = (auVar73._8_4_ + auVar204._8_4_) * 0.5;
            auVar151._12_4_ = (auVar73._12_4_ + auVar204._12_4_) * 0.5;
            auVar73 = vshufps_avx(auVar151,auVar151,0);
            fVar191 = auVar73._0_4_;
            fVar155 = auVar73._4_4_;
            fVar192 = auVar73._8_4_;
            fVar156 = auVar73._12_4_;
            local_548 = auVar15._0_4_;
            fStack_544 = auVar15._4_4_;
            fStack_540 = auVar15._8_4_;
            fStack_53c = auVar15._12_4_;
            auVar101._0_4_ = fVar191 * (float)local_268._0_4_ + local_548;
            auVar101._4_4_ = fVar155 * (float)local_268._4_4_ + fStack_544;
            auVar101._8_4_ = fVar192 * fStack_260 + fStack_540;
            auVar101._12_4_ = fVar156 * fStack_25c + fStack_53c;
            local_5c8._0_4_ = auVar260._0_4_;
            local_5c8._4_4_ = auVar260._4_4_;
            fStack_5c0 = auVar260._8_4_;
            fStack_5bc = auVar260._12_4_;
            auVar131._0_4_ = fVar191 * (float)local_278._0_4_ + (float)local_5c8._0_4_;
            auVar131._4_4_ = fVar155 * (float)local_278._4_4_ + (float)local_5c8._4_4_;
            auVar131._8_4_ = fVar192 * fStack_270 + fStack_5c0;
            auVar131._12_4_ = fVar156 * fStack_26c + fStack_5bc;
            local_558 = auVar16._0_4_;
            fStack_554 = auVar16._4_4_;
            fStack_550 = auVar16._8_4_;
            fStack_54c = auVar16._12_4_;
            auVar185._0_4_ = fVar191 * (float)local_288._0_4_ + local_558;
            auVar185._4_4_ = fVar155 * (float)local_288._4_4_ + fStack_554;
            auVar185._8_4_ = fVar192 * fStack_280 + fStack_550;
            auVar185._12_4_ = fVar156 * fStack_27c + fStack_54c;
            auVar73 = vsubps_avx(auVar131,auVar101);
            auVar102._0_4_ = auVar101._0_4_ + fVar191 * auVar73._0_4_;
            auVar102._4_4_ = auVar101._4_4_ + fVar155 * auVar73._4_4_;
            auVar102._8_4_ = auVar101._8_4_ + fVar192 * auVar73._8_4_;
            auVar102._12_4_ = auVar101._12_4_ + fVar156 * auVar73._12_4_;
            auVar73 = vsubps_avx(auVar185,auVar131);
            auVar132._0_4_ = auVar131._0_4_ + fVar191 * auVar73._0_4_;
            auVar132._4_4_ = auVar131._4_4_ + fVar155 * auVar73._4_4_;
            auVar132._8_4_ = auVar131._8_4_ + fVar192 * auVar73._8_4_;
            auVar132._12_4_ = auVar131._12_4_ + fVar156 * auVar73._12_4_;
            auVar73 = vsubps_avx(auVar132,auVar102);
            fVar191 = auVar102._0_4_ + fVar191 * auVar73._0_4_;
            fVar155 = auVar102._4_4_ + fVar155 * auVar73._4_4_;
            auVar77._0_8_ = CONCAT44(fVar155,fVar191);
            auVar77._8_4_ = auVar102._8_4_ + fVar192 * auVar73._8_4_;
            auVar77._12_4_ = auVar102._12_4_ + fVar156 * auVar73._12_4_;
            fVar192 = auVar73._0_4_ * 3.0;
            fVar156 = auVar73._4_4_ * 3.0;
            auVar103._0_8_ = CONCAT44(fVar156,fVar192);
            auVar103._8_4_ = auVar73._8_4_ * 3.0;
            auVar103._12_4_ = auVar73._12_4_ * 3.0;
            auVar133._8_8_ = auVar77._0_8_;
            auVar133._0_8_ = auVar77._0_8_;
            auVar73 = vshufpd_avx(auVar77,auVar77,3);
            auVar198 = vshufps_avx(auVar151,auVar151,0x55);
            auVar127 = vsubps_avx(auVar73,auVar133);
            auVar273._0_4_ = auVar127._0_4_ * auVar198._0_4_ + fVar191;
            auVar273._4_4_ = auVar127._4_4_ * auVar198._4_4_ + fVar155;
            auVar273._8_4_ = auVar127._8_4_ * auVar198._8_4_ + fVar191;
            auVar273._12_4_ = auVar127._12_4_ * auVar198._12_4_ + fVar155;
            auVar134._8_8_ = auVar103._0_8_;
            auVar134._0_8_ = auVar103._0_8_;
            auVar73 = vshufpd_avx(auVar103,auVar103,1);
            auVar73 = vsubps_avx(auVar73,auVar134);
            auVar104._0_4_ = auVar73._0_4_ * auVar198._0_4_ + fVar192;
            auVar104._4_4_ = auVar73._4_4_ * auVar198._4_4_ + fVar156;
            auVar104._8_4_ = auVar73._8_4_ * auVar198._8_4_ + fVar192;
            auVar104._12_4_ = auVar73._12_4_ * auVar198._12_4_ + fVar156;
            auVar198 = vmovshdup_avx(auVar104);
            auVar186._0_8_ = auVar198._0_8_ ^ 0x8000000080000000;
            auVar186._8_4_ = auVar198._8_4_ ^ 0x80000000;
            auVar186._12_4_ = auVar198._12_4_ ^ 0x80000000;
            auVar141 = vmovshdup_avx(auVar127);
            auVar73 = vunpcklps_avx(auVar141,auVar186);
            auVar67 = vshufps_avx(auVar73,auVar186,4);
            auVar78._0_8_ = auVar127._0_8_ ^ 0x8000000080000000;
            auVar78._8_4_ = -auVar127._8_4_;
            auVar78._12_4_ = -auVar127._12_4_;
            auVar73 = vmovlhps_avx(auVar78,auVar104);
            auVar99 = vshufps_avx(auVar73,auVar104,8);
            auVar73 = ZEXT416((uint)(auVar104._0_4_ * auVar141._0_4_ -
                                    auVar127._0_4_ * auVar198._0_4_));
            auVar198 = vshufps_avx(auVar73,auVar73,0);
            auVar73 = vdivps_avx(auVar67,auVar198);
            auVar198 = vdivps_avx(auVar99,auVar198);
            auVar99 = vinsertps_avx(auVar227,auVar287,0x1c);
            auVar127 = vinsertps_avx(auVar236,auVar295,0x1c);
            auVar100 = vinsertps_avx(auVar287,auVar227,0x4c);
            auVar119 = vinsertps_avx(auVar295,auVar236,0x4c);
            auVar141 = vmovsldup_avx(auVar73);
            auVar135._0_4_ = auVar141._0_4_ * auVar99._0_4_;
            auVar135._4_4_ = auVar141._4_4_ * auVar99._4_4_;
            auVar135._8_4_ = auVar141._8_4_ * auVar99._8_4_;
            auVar135._12_4_ = auVar141._12_4_ * auVar99._12_4_;
            auVar105._0_4_ = auVar127._0_4_ * auVar141._0_4_;
            auVar105._4_4_ = auVar127._4_4_ * auVar141._4_4_;
            auVar105._8_4_ = auVar127._8_4_ * auVar141._8_4_;
            auVar105._12_4_ = auVar127._12_4_ * auVar141._12_4_;
            auVar67 = vminps_avx(auVar135,auVar105);
            auVar141 = vmaxps_avx(auVar105,auVar135);
            auVar118 = vmovsldup_avx(auVar198);
            auVar296._0_4_ = auVar100._0_4_ * auVar118._0_4_;
            auVar296._4_4_ = auVar100._4_4_ * auVar118._4_4_;
            auVar296._8_4_ = auVar100._8_4_ * auVar118._8_4_;
            auVar296._12_4_ = auVar100._12_4_ * auVar118._12_4_;
            auVar136._0_4_ = auVar119._0_4_ * auVar118._0_4_;
            auVar136._4_4_ = auVar119._4_4_ * auVar118._4_4_;
            auVar136._8_4_ = auVar119._8_4_ * auVar118._8_4_;
            auVar136._12_4_ = auVar119._12_4_ * auVar118._12_4_;
            auVar118 = vminps_avx(auVar296,auVar136);
            auVar166._0_4_ = auVar67._0_4_ + auVar118._0_4_;
            auVar166._4_4_ = auVar67._4_4_ + auVar118._4_4_;
            auVar166._8_4_ = auVar67._8_4_ + auVar118._8_4_;
            auVar166._12_4_ = auVar67._12_4_ + auVar118._12_4_;
            auVar67 = vmaxps_avx(auVar136,auVar296);
            auVar118 = vsubps_avx(auVar251,auVar151);
            auVar121 = vsubps_avx(auVar263,auVar151);
            auVar106._0_4_ = auVar141._0_4_ + auVar67._0_4_;
            auVar106._4_4_ = auVar141._4_4_ + auVar67._4_4_;
            auVar106._8_4_ = auVar141._8_4_ + auVar67._8_4_;
            auVar106._12_4_ = auVar141._12_4_ + auVar67._12_4_;
            auVar137._8_8_ = 0x3f800000;
            auVar137._0_8_ = 0x3f800000;
            auVar141 = vsubps_avx(auVar137,auVar106);
            auVar67 = vsubps_avx(auVar137,auVar166);
            fVar208 = auVar118._0_4_;
            auVar167._0_4_ = fVar208 * auVar141._0_4_;
            fVar209 = auVar118._4_4_;
            auVar167._4_4_ = fVar209 * auVar141._4_4_;
            fVar257 = auVar118._8_4_;
            auVar167._8_4_ = fVar257 * auVar141._8_4_;
            fVar268 = auVar118._12_4_;
            auVar167._12_4_ = fVar268 * auVar141._12_4_;
            fVar192 = auVar121._0_4_;
            auVar107._0_4_ = fVar192 * auVar141._0_4_;
            fVar156 = auVar121._4_4_;
            auVar107._4_4_ = fVar156 * auVar141._4_4_;
            fVar193 = auVar121._8_4_;
            auVar107._8_4_ = fVar193 * auVar141._8_4_;
            fVar207 = auVar121._12_4_;
            auVar107._12_4_ = fVar207 * auVar141._12_4_;
            auVar264._0_4_ = fVar208 * auVar67._0_4_;
            auVar264._4_4_ = fVar209 * auVar67._4_4_;
            auVar264._8_4_ = fVar257 * auVar67._8_4_;
            auVar264._12_4_ = fVar268 * auVar67._12_4_;
            auVar138._0_4_ = fVar192 * auVar67._0_4_;
            auVar138._4_4_ = fVar156 * auVar67._4_4_;
            auVar138._8_4_ = fVar193 * auVar67._8_4_;
            auVar138._12_4_ = fVar207 * auVar67._12_4_;
            auVar141 = vminps_avx(auVar167,auVar264);
            auVar67 = vminps_avx(auVar107,auVar138);
            auVar118 = vminps_avx(auVar141,auVar67);
            auVar141 = vmaxps_avx(auVar264,auVar167);
            auVar67 = vmaxps_avx(auVar138,auVar107);
            auVar121 = vshufps_avx(auVar151,auVar151,0x54);
            auVar67 = vmaxps_avx(auVar67,auVar141);
            auVar145 = vshufps_avx(auVar273,auVar273,0);
            auVar146 = vshufps_avx(auVar273,auVar273,0x55);
            auVar141 = vhaddps_avx(auVar118,auVar118);
            auVar67 = vhaddps_avx(auVar67,auVar67);
            auVar152._0_4_ = auVar145._0_4_ * auVar73._0_4_ + auVar146._0_4_ * auVar198._0_4_;
            auVar152._4_4_ = auVar145._4_4_ * auVar73._4_4_ + auVar146._4_4_ * auVar198._4_4_;
            auVar152._8_4_ = auVar145._8_4_ * auVar73._8_4_ + auVar146._8_4_ * auVar198._8_4_;
            auVar152._12_4_ = auVar145._12_4_ * auVar73._12_4_ + auVar146._12_4_ * auVar198._12_4_;
            auVar118 = vsubps_avx(auVar121,auVar152);
            fVar191 = auVar118._0_4_ + auVar141._0_4_;
            fVar155 = auVar118._0_4_ + auVar67._0_4_;
            auVar141 = vmaxss_avx(ZEXT416((uint)fVar154),ZEXT416((uint)fVar191));
            auVar67 = vminss_avx(ZEXT416((uint)fVar155),ZEXT416((uint)fVar144));
            if (auVar141._0_4_ <= auVar67._0_4_) {
              auVar141 = vmovshdup_avx(auVar73);
              auVar79._0_4_ = auVar141._0_4_ * auVar99._0_4_;
              auVar79._4_4_ = auVar141._4_4_ * auVar99._4_4_;
              auVar79._8_4_ = auVar141._8_4_ * auVar99._8_4_;
              auVar79._12_4_ = auVar141._12_4_ * auVar99._12_4_;
              auVar108._0_4_ = auVar127._0_4_ * auVar141._0_4_;
              auVar108._4_4_ = auVar127._4_4_ * auVar141._4_4_;
              auVar108._8_4_ = auVar127._8_4_ * auVar141._8_4_;
              auVar108._12_4_ = auVar127._12_4_ * auVar141._12_4_;
              auVar67 = vminps_avx(auVar79,auVar108);
              auVar141 = vmaxps_avx(auVar108,auVar79);
              auVar99 = vmovshdup_avx(auVar198);
              auVar168._0_4_ = auVar100._0_4_ * auVar99._0_4_;
              auVar168._4_4_ = auVar100._4_4_ * auVar99._4_4_;
              auVar168._8_4_ = auVar100._8_4_ * auVar99._8_4_;
              auVar168._12_4_ = auVar100._12_4_ * auVar99._12_4_;
              auVar109._0_4_ = auVar119._0_4_ * auVar99._0_4_;
              auVar109._4_4_ = auVar119._4_4_ * auVar99._4_4_;
              auVar109._8_4_ = auVar119._8_4_ * auVar99._8_4_;
              auVar109._12_4_ = auVar119._12_4_ * auVar99._12_4_;
              auVar99 = vminps_avx(auVar168,auVar109);
              auVar139._0_4_ = auVar67._0_4_ + auVar99._0_4_;
              auVar139._4_4_ = auVar67._4_4_ + auVar99._4_4_;
              auVar139._8_4_ = auVar67._8_4_ + auVar99._8_4_;
              auVar139._12_4_ = auVar67._12_4_ + auVar99._12_4_;
              auVar67 = vmaxps_avx(auVar109,auVar168);
              auVar80._0_4_ = auVar141._0_4_ + auVar67._0_4_;
              auVar80._4_4_ = auVar141._4_4_ + auVar67._4_4_;
              auVar80._8_4_ = auVar141._8_4_ + auVar67._8_4_;
              auVar80._12_4_ = auVar141._12_4_ + auVar67._12_4_;
              auVar141 = vsubps_avx(auVar202,auVar80);
              auVar67 = vsubps_avx(auVar202,auVar139);
              auVar140._0_4_ = fVar208 * auVar141._0_4_;
              auVar140._4_4_ = fVar209 * auVar141._4_4_;
              auVar140._8_4_ = fVar257 * auVar141._8_4_;
              auVar140._12_4_ = fVar268 * auVar141._12_4_;
              auVar169._0_4_ = fVar208 * auVar67._0_4_;
              auVar169._4_4_ = fVar209 * auVar67._4_4_;
              auVar169._8_4_ = fVar257 * auVar67._8_4_;
              auVar169._12_4_ = fVar268 * auVar67._12_4_;
              auVar81._0_4_ = fVar192 * auVar141._0_4_;
              auVar81._4_4_ = fVar156 * auVar141._4_4_;
              auVar81._8_4_ = fVar193 * auVar141._8_4_;
              auVar81._12_4_ = fVar207 * auVar141._12_4_;
              auVar110._0_4_ = fVar192 * auVar67._0_4_;
              auVar110._4_4_ = fVar156 * auVar67._4_4_;
              auVar110._8_4_ = fVar193 * auVar67._8_4_;
              auVar110._12_4_ = fVar207 * auVar67._12_4_;
              auVar141 = vminps_avx(auVar140,auVar169);
              auVar67 = vminps_avx(auVar81,auVar110);
              auVar141 = vminps_avx(auVar141,auVar67);
              auVar67 = vmaxps_avx(auVar169,auVar140);
              auVar99 = vmaxps_avx(auVar110,auVar81);
              auVar141 = vhaddps_avx(auVar141,auVar141);
              auVar67 = vmaxps_avx(auVar99,auVar67);
              auVar67 = vhaddps_avx(auVar67,auVar67);
              auVar99 = vmovshdup_avx(auVar118);
              auVar127 = ZEXT416((uint)(auVar99._0_4_ + auVar141._0_4_));
              auVar141 = vmaxss_avx(auVar204,auVar127);
              auVar99 = ZEXT416((uint)(auVar99._0_4_ + auVar67._0_4_));
              auVar67 = vminss_avx(auVar99,auVar120);
              if (auVar141._0_4_ <= auVar67._0_4_) {
                bVar60 = 0;
                if ((fVar154 < fVar191) && (fVar155 < fVar144)) {
                  auVar141 = vcmpps_avx(auVar99,auVar120,1);
                  auVar67 = vcmpps_avx(auVar204,auVar127,1);
                  auVar141 = vandps_avx(auVar67,auVar141);
                  bVar60 = auVar141[0];
                }
                auVar267 = ZEXT1664(auVar204);
                if ((uVar61 < 4 && 0.001 <= fVar190) && (bVar60 & 1) == 0) goto LAB_00e0cc3f;
                lVar58 = 200;
                do {
                  fVar190 = auVar118._0_4_;
                  fVar144 = 1.0 - fVar190;
                  auVar141 = ZEXT416((uint)(fVar144 * fVar144 * fVar144));
                  auVar141 = vshufps_avx(auVar141,auVar141,0);
                  auVar67 = ZEXT416((uint)(fVar190 * 3.0 * fVar144 * fVar144));
                  auVar67 = vshufps_avx(auVar67,auVar67,0);
                  auVar99 = ZEXT416((uint)(fVar144 * fVar190 * fVar190 * 3.0));
                  auVar99 = vshufps_avx(auVar99,auVar99,0);
                  auVar127 = ZEXT416((uint)(fVar190 * fVar190 * fVar190));
                  auVar127 = vshufps_avx(auVar127,auVar127,0);
                  local_4a8._0_4_ = auVar66._0_4_;
                  local_4a8._4_4_ = auVar66._4_4_;
                  fStack_4a0 = auVar66._8_4_;
                  fStack_49c = auVar66._12_4_;
                  fVar144 = auVar141._0_4_ * local_548 +
                            auVar67._0_4_ * (float)local_5c8._0_4_ +
                            auVar127._0_4_ * (float)local_4a8._0_4_ + auVar99._0_4_ * local_558;
                  fVar190 = auVar141._4_4_ * fStack_544 +
                            auVar67._4_4_ * (float)local_5c8._4_4_ +
                            auVar127._4_4_ * (float)local_4a8._4_4_ + auVar99._4_4_ * fStack_554;
                  auVar82._0_8_ = CONCAT44(fVar190,fVar144);
                  auVar82._8_4_ =
                       auVar141._8_4_ * fStack_540 +
                       auVar67._8_4_ * fStack_5c0 +
                       auVar127._8_4_ * fStack_4a0 + auVar99._8_4_ * fStack_550;
                  auVar82._12_4_ =
                       auVar141._12_4_ * fStack_53c +
                       auVar67._12_4_ * fStack_5bc +
                       auVar127._12_4_ * fStack_49c + auVar99._12_4_ * fStack_54c;
                  auVar111._8_8_ = auVar82._0_8_;
                  auVar111._0_8_ = auVar82._0_8_;
                  auVar67 = vshufpd_avx(auVar82,auVar82,1);
                  auVar141 = vmovshdup_avx(auVar118);
                  auVar67 = vsubps_avx(auVar67,auVar111);
                  auVar83._0_4_ = auVar141._0_4_ * auVar67._0_4_ + fVar144;
                  auVar83._4_4_ = auVar141._4_4_ * auVar67._4_4_ + fVar190;
                  auVar83._8_4_ = auVar141._8_4_ * auVar67._8_4_ + fVar144;
                  auVar83._12_4_ = auVar141._12_4_ * auVar67._12_4_ + fVar190;
                  auVar141 = vshufps_avx(auVar83,auVar83,0);
                  auVar67 = vshufps_avx(auVar83,auVar83,0x55);
                  auVar112._0_4_ = auVar73._0_4_ * auVar141._0_4_ + auVar198._0_4_ * auVar67._0_4_;
                  auVar112._4_4_ = auVar73._4_4_ * auVar141._4_4_ + auVar198._4_4_ * auVar67._4_4_;
                  auVar112._8_4_ = auVar73._8_4_ * auVar141._8_4_ + auVar198._8_4_ * auVar67._8_4_;
                  auVar112._12_4_ =
                       auVar73._12_4_ * auVar141._12_4_ + auVar198._12_4_ * auVar67._12_4_;
                  auVar118 = vsubps_avx(auVar118,auVar112);
                  auVar113._8_4_ = 0x7fffffff;
                  auVar113._0_8_ = 0x7fffffff7fffffff;
                  auVar113._12_4_ = 0x7fffffff;
                  auVar141 = vandps_avx(auVar83,auVar113);
                  auVar67 = vshufps_avx(auVar141,auVar141,0xf5);
                  auVar141 = vmaxss_avx(auVar67,auVar141);
                  if (auVar141._0_4_ < (float)local_258._0_4_) {
                    fVar144 = auVar118._0_4_;
                    if ((0.0 <= fVar144) && (fVar144 <= 1.0)) {
                      auVar73 = vmovshdup_avx(auVar118);
                      fVar190 = auVar73._0_4_;
                      if ((0.0 <= fVar190) && (fVar190 <= 1.0)) {
                        auVar73 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                                ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                                0x1c);
                        auVar119 = vinsertps_avx(auVar73,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                       m128[2]),0x28);
                        auVar73 = vdpps_avx(auVar119,local_298,0x7f);
                        auVar198 = vdpps_avx(auVar119,local_2a8,0x7f);
                        auVar141 = vdpps_avx(auVar119,local_2b8,0x7f);
                        auVar67 = vdpps_avx(auVar119,local_2c8,0x7f);
                        auVar99 = vdpps_avx(auVar119,local_2d8,0x7f);
                        auVar127 = vdpps_avx(auVar119,local_2e8,0x7f);
                        auVar100 = vdpps_avx(auVar119,local_2f8,0x7f);
                        auVar119 = vdpps_avx(auVar119,local_308,0x7f);
                        fVar156 = 1.0 - fVar190;
                        fVar193 = 1.0 - fVar144;
                        fVar154 = auVar118._4_4_;
                        fVar191 = auVar118._8_4_;
                        fVar155 = auVar118._12_4_;
                        fVar192 = fVar193 * fVar144 * fVar144 * 3.0;
                        auVar220._0_4_ = fVar144 * fVar144 * fVar144;
                        auVar220._4_4_ = fVar154 * fVar154 * fVar154;
                        auVar220._8_4_ = fVar191 * fVar191 * fVar191;
                        auVar220._12_4_ = fVar155 * fVar155 * fVar155;
                        fVar191 = fVar193 * fVar193 * fVar144 * 3.0;
                        fVar155 = fVar193 * fVar193 * fVar193;
                        fVar154 = fVar155 * (fVar156 * auVar73._0_4_ + fVar190 * auVar99._0_4_) +
                                  (fVar156 * auVar198._0_4_ + auVar127._0_4_ * fVar190) * fVar191 +
                                  fVar192 * (auVar100._0_4_ * fVar190 + fVar156 * auVar141._0_4_) +
                                  auVar220._0_4_ *
                                  (fVar156 * auVar67._0_4_ + fVar190 * auVar119._0_4_);
                        auVar73 = ZEXT416((uint)fVar154);
                        if (((fVar174 <= fVar154) &&
                            (fVar156 = *(float *)(ray + k * 4 + 0x80), fVar154 <= fVar156)) &&
                           (pGVar10 = (context->scene->geometries).items[uVar57].ptr,
                           (pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
                          local_1a8 = vshufps_avx(auVar118,auVar118,0x55);
                          auVar237._8_4_ = 0x3f800000;
                          auVar237._0_8_ = 0x3f8000003f800000;
                          auVar237._12_4_ = 0x3f800000;
                          auVar198 = vsubps_avx(auVar237,local_1a8);
                          fVar207 = local_1a8._0_4_;
                          fVar208 = local_1a8._4_4_;
                          fVar209 = local_1a8._8_4_;
                          fVar257 = local_1a8._12_4_;
                          fVar268 = auVar198._0_4_;
                          fVar269 = auVar198._4_4_;
                          fVar270 = auVar198._8_4_;
                          fVar271 = auVar198._12_4_;
                          auVar252._0_4_ =
                               fVar207 * (float)local_3e8._0_4_ + fVar268 * (float)local_3d8._0_4_;
                          auVar252._4_4_ =
                               fVar208 * (float)local_3e8._4_4_ + fVar269 * (float)local_3d8._4_4_;
                          auVar252._8_4_ = fVar209 * fStack_3e0 + fVar270 * fStack_3d0;
                          auVar252._12_4_ = fVar257 * fStack_3dc + fVar271 * fStack_3cc;
                          auVar265._0_4_ =
                               fVar207 * (float)local_428._0_4_ + fVar268 * (float)local_408._0_4_;
                          auVar265._4_4_ =
                               fVar208 * (float)local_428._4_4_ + fVar269 * (float)local_408._4_4_;
                          auVar265._8_4_ = fVar209 * fStack_420 + fVar270 * fStack_400;
                          auVar265._12_4_ = fVar257 * fStack_41c + fVar271 * fStack_3fc;
                          auVar274._0_4_ =
                               fVar207 * (float)local_328._0_4_ + fVar268 * (float)local_418._0_4_;
                          auVar274._4_4_ =
                               fVar208 * (float)local_328._4_4_ + fVar269 * (float)local_418._4_4_;
                          auVar274._8_4_ = fVar209 * fStack_320 + fVar270 * fStack_410;
                          auVar274._12_4_ = fVar257 * fStack_31c + fVar271 * fStack_40c;
                          auVar238._0_4_ = fVar207 * fVar65 + fVar268 * (float)local_3f8._0_4_;
                          auVar238._4_4_ = fVar208 * fVar92 + fVar269 * (float)local_3f8._4_4_;
                          auVar238._8_4_ = fVar209 * fVar93 + fVar270 * fStack_3f0;
                          auVar238._12_4_ = fVar257 * fVar94 + fVar271 * fStack_3ec;
                          auVar99 = vsubps_avx(auVar265,auVar252);
                          auVar127 = vsubps_avx(auVar274,auVar265);
                          auVar100 = vsubps_avx(auVar238,auVar274);
                          local_1b8 = vshufps_avx(auVar118,auVar118,0);
                          fVar257 = local_1b8._0_4_;
                          fVar268 = local_1b8._4_4_;
                          fVar269 = local_1b8._8_4_;
                          fVar270 = local_1b8._12_4_;
                          auVar198 = vshufps_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193),0);
                          fVar193 = auVar198._0_4_;
                          fVar207 = auVar198._4_4_;
                          fVar208 = auVar198._8_4_;
                          fVar209 = auVar198._12_4_;
                          auVar198 = vshufps_avx(auVar220,auVar220,0);
                          auVar141 = vshufps_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192),0);
                          auVar67 = vshufps_avx(ZEXT416((uint)fVar191),ZEXT416((uint)fVar191),0);
                          auVar205._0_4_ =
                               (fVar193 * (fVar193 * auVar99._0_4_ + fVar257 * auVar127._0_4_) +
                               fVar257 * (fVar193 * auVar127._0_4_ + fVar257 * auVar100._0_4_)) *
                               3.0;
                          auVar205._4_4_ =
                               (fVar207 * (fVar207 * auVar99._4_4_ + fVar268 * auVar127._4_4_) +
                               fVar268 * (fVar207 * auVar127._4_4_ + fVar268 * auVar100._4_4_)) *
                               3.0;
                          auVar205._8_4_ =
                               (fVar208 * (fVar208 * auVar99._8_4_ + fVar269 * auVar127._8_4_) +
                               fVar269 * (fVar208 * auVar127._8_4_ + fVar269 * auVar100._8_4_)) *
                               3.0;
                          auVar205._12_4_ =
                               (fVar209 * (fVar209 * auVar99._12_4_ + fVar270 * auVar127._12_4_) +
                               fVar270 * (fVar209 * auVar127._12_4_ + fVar270 * auVar100._12_4_)) *
                               3.0;
                          auVar99 = vshufps_avx(ZEXT416((uint)fVar155),ZEXT416((uint)fVar155),0);
                          auVar170._0_4_ =
                               auVar99._0_4_ * (float)local_338._0_4_ +
                               auVar67._0_4_ * (float)local_348._0_4_ +
                               auVar198._0_4_ * (float)local_368._0_4_ +
                               auVar141._0_4_ * (float)local_358._0_4_;
                          auVar170._4_4_ =
                               auVar99._4_4_ * (float)local_338._4_4_ +
                               auVar67._4_4_ * (float)local_348._4_4_ +
                               auVar198._4_4_ * (float)local_368._4_4_ +
                               auVar141._4_4_ * (float)local_358._4_4_;
                          auVar170._8_4_ =
                               auVar99._8_4_ * fStack_330 +
                               auVar67._8_4_ * fStack_340 +
                               auVar198._8_4_ * fStack_360 + auVar141._8_4_ * fStack_350;
                          auVar170._12_4_ =
                               auVar99._12_4_ * fStack_32c +
                               auVar67._12_4_ * fStack_33c +
                               auVar198._12_4_ * fStack_35c + auVar141._12_4_ * fStack_34c;
                          auVar198 = vshufps_avx(auVar205,auVar205,0xc9);
                          auVar187._0_4_ = auVar170._0_4_ * auVar198._0_4_;
                          auVar187._4_4_ = auVar170._4_4_ * auVar198._4_4_;
                          auVar187._8_4_ = auVar170._8_4_ * auVar198._8_4_;
                          auVar187._12_4_ = auVar170._12_4_ * auVar198._12_4_;
                          auVar198 = vshufps_avx(auVar170,auVar170,0xc9);
                          auVar171._0_4_ = auVar205._0_4_ * auVar198._0_4_;
                          auVar171._4_4_ = auVar205._4_4_ * auVar198._4_4_;
                          auVar171._8_4_ = auVar205._8_4_ * auVar198._8_4_;
                          auVar171._12_4_ = auVar205._12_4_ * auVar198._12_4_;
                          auVar198 = vsubps_avx(auVar171,auVar187);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar154;
                            uVar6 = vextractps_avx(auVar198,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar6;
                            uVar6 = vextractps_avx(auVar198,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar6;
                            *(int *)(ray + k * 4 + 0xe0) = auVar198._0_4_;
                            *(float *)(ray + k * 4 + 0xf0) = fVar144;
                            *(float *)(ray + k * 4 + 0x100) = fVar190;
                            *(uint *)(ray + k * 4 + 0x110) = uVar9;
                            *(uint *)(ray + k * 4 + 0x120) = uVar57;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            auVar141 = vshufps_avx(auVar198,auVar198,0x55);
                            auVar67 = vshufps_avx(auVar198,auVar198,0xaa);
                            local_1c8 = vshufps_avx(auVar198,auVar198,0);
                            local_1e8[0] = (RTCHitN)auVar141[0];
                            local_1e8[1] = (RTCHitN)auVar141[1];
                            local_1e8[2] = (RTCHitN)auVar141[2];
                            local_1e8[3] = (RTCHitN)auVar141[3];
                            local_1e8[4] = (RTCHitN)auVar141[4];
                            local_1e8[5] = (RTCHitN)auVar141[5];
                            local_1e8[6] = (RTCHitN)auVar141[6];
                            local_1e8[7] = (RTCHitN)auVar141[7];
                            local_1e8[8] = (RTCHitN)auVar141[8];
                            local_1e8[9] = (RTCHitN)auVar141[9];
                            local_1e8[10] = (RTCHitN)auVar141[10];
                            local_1e8[0xb] = (RTCHitN)auVar141[0xb];
                            local_1e8[0xc] = (RTCHitN)auVar141[0xc];
                            local_1e8[0xd] = (RTCHitN)auVar141[0xd];
                            local_1e8[0xe] = (RTCHitN)auVar141[0xe];
                            local_1e8[0xf] = (RTCHitN)auVar141[0xf];
                            local_1d8 = auVar67;
                            local_198 = local_398._0_8_;
                            uStack_190 = local_398._8_8_;
                            local_188 = local_388._0_8_;
                            uStack_180 = local_388._8_8_;
                            vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                            uStack_174 = context->user->instID[0];
                            local_178 = uStack_174;
                            uStack_170 = uStack_174;
                            uStack_16c = uStack_174;
                            uStack_168 = context->user->instPrimID[0];
                            uStack_164 = uStack_168;
                            uStack_160 = uStack_168;
                            uStack_15c = uStack_168;
                            *(float *)(ray + k * 4 + 0x80) = fVar154;
                            local_498 = *local_480;
                            local_458.valid = (int *)local_498;
                            local_458.geometryUserPtr = pGVar10->userPtr;
                            local_458.context = context->user;
                            local_458.hit = local_1e8;
                            local_458.N = 4;
                            local_458.ray = (RTCRayN *)ray;
                            if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar10->intersectionFilterN)(&local_458);
                              auVar267._8_56_ = extraout_var;
                              auVar267._0_8_ = extraout_XMM1_Qa;
                              auVar73 = auVar267._0_16_;
                            }
                            if (local_498 == (undefined1  [16])0x0) {
                              auVar198 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar73 = vpcmpeqd_avx(auVar73,auVar73);
                              auVar198 = auVar198 ^ auVar73;
                            }
                            else {
                              p_Var11 = context->args->filter;
                              auVar73 = vpcmpeqd_avx(auVar67,auVar67);
                              if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var11)(&local_458);
                                auVar73 = vpcmpeqd_avx(auVar73,auVar73);
                              }
                              auVar141 = vpcmpeqd_avx(local_498,_DAT_01f7aa10);
                              auVar198 = auVar141 ^ auVar73;
                              if (local_498 != (undefined1  [16])0x0) {
                                auVar141 = auVar141 ^ auVar73;
                                auVar73 = vmaskmovps_avx(auVar141,*(undefined1 (*) [16])
                                                                   local_458.hit);
                                *(undefined1 (*) [16])(local_458.ray + 0xc0) = auVar73;
                                auVar73 = vmaskmovps_avx(auVar141,*(undefined1 (*) [16])
                                                                   (local_458.hit + 0x10));
                                *(undefined1 (*) [16])(local_458.ray + 0xd0) = auVar73;
                                auVar73 = vmaskmovps_avx(auVar141,*(undefined1 (*) [16])
                                                                   (local_458.hit + 0x20));
                                *(undefined1 (*) [16])(local_458.ray + 0xe0) = auVar73;
                                auVar73 = vmaskmovps_avx(auVar141,*(undefined1 (*) [16])
                                                                   (local_458.hit + 0x30));
                                *(undefined1 (*) [16])(local_458.ray + 0xf0) = auVar73;
                                auVar73 = vmaskmovps_avx(auVar141,*(undefined1 (*) [16])
                                                                   (local_458.hit + 0x40));
                                *(undefined1 (*) [16])(local_458.ray + 0x100) = auVar73;
                                auVar73 = vmaskmovps_avx(auVar141,*(undefined1 (*) [16])
                                                                   (local_458.hit + 0x50));
                                *(undefined1 (*) [16])(local_458.ray + 0x110) = auVar73;
                                auVar73 = vmaskmovps_avx(auVar141,*(undefined1 (*) [16])
                                                                   (local_458.hit + 0x60));
                                *(undefined1 (*) [16])(local_458.ray + 0x120) = auVar73;
                                auVar73 = vmaskmovps_avx(auVar141,*(undefined1 (*) [16])
                                                                   (local_458.hit + 0x70));
                                *(undefined1 (*) [16])(local_458.ray + 0x130) = auVar73;
                                auVar73 = vmaskmovps_avx(auVar141,*(undefined1 (*) [16])
                                                                   (local_458.hit + 0x80));
                                *(undefined1 (*) [16])(local_458.ray + 0x140) = auVar73;
                              }
                            }
                            auVar84._8_8_ = 0x100000001;
                            auVar84._0_8_ = 0x100000001;
                            if ((auVar84 & auVar198) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar156;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar58 = lVar58 + -1;
                } while (lVar58 != 0);
              }
            }
          }
        }
        if (uVar61 == 0) break;
      } while( true );
    }
    uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar85._4_4_ = uVar6;
    auVar85._0_4_ = uVar6;
    auVar85._8_4_ = uVar6;
    auVar85._12_4_ = uVar6;
    auVar73 = vcmpps_avx(local_378,auVar85,2);
    uVar57 = vmovmskps_avx(auVar73);
    uVar57 = (uint)uVar64 & uVar57;
    if (uVar57 == 0) {
      return;
    }
  } while( true );
LAB_00e0cc3f:
  auVar73 = vinsertps_avx(ZEXT416((uint)fVar154),ZEXT416((uint)fVar144),0x10);
  auVar275 = ZEXT1664(auVar73);
  goto LAB_00e0b505;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }